

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_3x3_int8.h
# Opt level: O1

void ncnn::conv3x3s1_winograd23_int8_sse(Mat *bottom_blob,Mat *top_blob,Mat *kernel_tm,Option *opt)

{
  long lVar1;
  long lVar2;
  uint _c;
  int iVar3;
  int *piVar4;
  size_t sVar5;
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [14];
  undefined1 auVar10 [14];
  undefined1 auVar11 [14];
  undefined1 auVar12 [14];
  undefined1 auVar13 [14];
  undefined1 auVar14 [14];
  undefined1 auVar15 [14];
  undefined1 auVar16 [14];
  undefined1 auVar17 [14];
  undefined1 auVar18 [14];
  undefined1 auVar19 [14];
  undefined1 auVar20 [14];
  undefined1 auVar21 [14];
  undefined1 auVar22 [14];
  undefined1 auVar23 [14];
  undefined1 auVar24 [14];
  undefined1 auVar25 [14];
  undefined1 auVar26 [14];
  undefined1 auVar27 [14];
  undefined1 auVar28 [14];
  undefined1 auVar29 [15];
  undefined1 auVar30 [15];
  undefined1 auVar31 [15];
  undefined1 auVar32 [14];
  undefined1 auVar33 [14];
  undefined1 auVar34 [14];
  undefined1 auVar35 [14];
  undefined1 auVar36 [14];
  undefined1 auVar37 [14];
  undefined1 auVar38 [14];
  undefined1 auVar39 [14];
  undefined1 auVar40 [14];
  undefined1 auVar41 [14];
  undefined1 auVar42 [14];
  undefined1 auVar43 [14];
  undefined1 auVar44 [14];
  undefined1 auVar45 [14];
  undefined1 auVar46 [14];
  undefined1 auVar47 [14];
  undefined1 auVar48 [14];
  undefined1 auVar49 [14];
  undefined1 auVar50 [14];
  undefined1 auVar51 [14];
  undefined1 auVar52 [14];
  undefined1 auVar53 [14];
  undefined1 auVar54 [14];
  undefined1 auVar55 [14];
  undefined1 auVar56 [14];
  undefined1 auVar57 [15];
  undefined1 auVar58 [15];
  undefined1 auVar59 [15];
  undefined1 auVar60 [14];
  undefined1 auVar61 [14];
  undefined1 auVar62 [14];
  undefined1 auVar63 [14];
  undefined1 auVar64 [14];
  undefined1 auVar65 [15];
  undefined1 auVar66 [15];
  undefined1 auVar67 [15];
  undefined1 auVar68 [14];
  undefined1 auVar69 [14];
  undefined1 auVar70 [15];
  undefined1 auVar71 [15];
  undefined1 auVar72 [15];
  undefined1 auVar73 [14];
  undefined1 auVar74 [14];
  undefined1 auVar75 [15];
  undefined1 auVar76 [15];
  undefined1 auVar77 [15];
  undefined4 uVar78;
  undefined4 uVar79;
  undefined1 auVar80 [12];
  undefined1 auVar81 [12];
  undefined1 auVar82 [12];
  undefined8 uVar83;
  undefined1 auVar84 [12];
  undefined1 auVar85 [14];
  undefined1 auVar86 [12];
  undefined1 auVar87 [14];
  undefined1 auVar88 [12];
  undefined1 auVar89 [14];
  undefined1 auVar90 [12];
  undefined1 auVar91 [14];
  undefined1 auVar92 [14];
  undefined1 auVar93 [14];
  undefined1 auVar94 [14];
  undefined1 auVar95 [14];
  undefined1 auVar96 [14];
  undefined1 auVar97 [14];
  undefined1 auVar98 [14];
  undefined1 auVar99 [14];
  undefined1 auVar100 [14];
  undefined1 auVar101 [14];
  undefined1 auVar102 [14];
  undefined1 auVar103 [14];
  undefined1 auVar104 [12];
  undefined1 auVar105 [14];
  undefined1 auVar106 [14];
  undefined1 auVar107 [14];
  undefined1 auVar108 [14];
  undefined1 auVar109 [14];
  undefined1 auVar110 [14];
  undefined1 auVar111 [14];
  undefined1 auVar112 [14];
  undefined1 auVar113 [14];
  undefined1 auVar114 [12];
  undefined1 auVar115 [12];
  undefined1 auVar116 [12];
  undefined1 auVar117 [12];
  undefined6 uVar118;
  ulong uVar119;
  undefined4 *puVar120;
  long lVar121;
  undefined8 *puVar122;
  uint uVar123;
  long lVar124;
  ulong uVar125;
  ulong uVar126;
  void *pvVar127;
  int iVar128;
  void *pvVar129;
  long lVar130;
  long lVar131;
  uint uVar132;
  void *pvVar133;
  ulong uVar134;
  ulong uVar135;
  int i;
  uint uVar136;
  void *pvVar137;
  ulong uVar138;
  long lVar139;
  void *pvVar140;
  long lVar141;
  undefined4 *puVar142;
  undefined4 *puVar143;
  void *pvVar144;
  uint uVar145;
  void *pvVar146;
  void *pvVar147;
  uint uVar148;
  undefined4 *puVar149;
  int iVar164;
  int iVar165;
  undefined1 auVar150 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  short sVar166;
  short sVar191;
  short sVar193;
  short sVar195;
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  short sVar196;
  int iVar197;
  short sVar224;
  int iVar226;
  int iVar229;
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  ushort uVar222;
  short sVar227;
  ushort uVar230;
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  short sVar223;
  short sVar225;
  short sVar228;
  undefined1 auVar205 [16];
  int iVar231;
  undefined1 auVar206 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar214 [16];
  undefined1 auVar218 [16];
  undefined4 uVar232;
  undefined1 in_XMM4 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar239 [16];
  undefined4 uVar240;
  short sVar252;
  short sVar254;
  uint uVar253;
  undefined1 in_XMM5 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  short sVar269;
  short sVar270;
  undefined1 auVar255 [12];
  undefined1 auVar256 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar271 [12];
  undefined1 auVar274 [12];
  undefined1 auVar275 [16];
  void *local_3a8;
  int tiles;
  int nRowBlocks;
  long local_390;
  void *local_378;
  long local_370;
  void *local_368;
  int nColBlocks;
  short d1 [4];
  int aiStack_340 [2];
  size_t local_338;
  int iStack_330;
  undefined4 uStack_32c;
  Allocator *local_328;
  int iStack_320;
  int iStack_31c;
  int local_318;
  int iStack_314;
  int iStack_310;
  undefined4 uStack_30c;
  size_t local_308;
  Mat *local_300;
  short local_2f8 [4];
  short local_2f0 [4];
  short local_2e8 [4];
  void *local_2e0;
  void *local_2d8;
  void *local_2d0;
  void *local_2c8;
  size_t local_2c0;
  long local_2b8;
  long local_2b0;
  short local_2a8 [4];
  void *local_2a0;
  ulong local_298;
  ulong local_290;
  void *local_288;
  void *local_280;
  void *local_278;
  void *local_270;
  void *local_268;
  long local_260;
  ulong local_258;
  uint local_24c;
  Mat local_248;
  short d0 [4];
  Mat local_1a8;
  ulong local_158;
  Mat *local_150;
  ulong local_148;
  long local_140;
  short d2 [4];
  int aiStack_130 [2];
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  short d3 [4];
  int aiStack_f0 [2];
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  int sum3 [16];
  Option opt_b;
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined2 uVar163;
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 uVar189;
  undefined1 uVar190;
  undefined1 uVar192;
  short sVar194;
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar202 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  short sVar251;
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar262 [16];
  undefined1 auVar259 [16];
  undefined1 auVar263 [16];
  short sVar272;
  short sVar273;
  undefined1 auVar276 [16];
  
  _c = bottom_blob->c;
  uVar123 = top_blob->w;
  local_258 = (ulong)uVar123;
  uVar148 = top_blob->h;
  local_290 = (ulong)uVar148;
  iVar3 = top_blob->c;
  uVar119 = (ulong)iVar3;
  local_1a8.data = bottom_blob->data;
  piVar4 = bottom_blob->refcount;
  local_1a8.refcount._0_4_ = SUB84(piVar4,0);
  local_1a8.refcount._4_4_ = (undefined4)((ulong)piVar4 >> 0x20);
  local_1a8.elemsize = bottom_blob->elemsize;
  local_1a8.elempack = bottom_blob->elempack;
  local_1a8.allocator = bottom_blob->allocator;
  uVar78 = bottom_blob->dims;
  uVar79 = bottom_blob->w;
  local_1a8.h = bottom_blob->h;
  local_1a8.d = bottom_blob->d;
  local_1a8.cstep = bottom_blob->cstep;
  if (piVar4 != (int *)0x0) {
    LOCK();
    *piVar4 = *piVar4 + 1;
    UNLOCK();
  }
  uVar145 = (uVar123 - ((int)(uVar123 + 1) >> 0x1f)) + 1;
  uVar123 = uVar145 & 0xfffffffe;
  local_148 = (ulong)uVar123;
  uVar148 = (uVar148 - ((int)(uVar148 + 1) >> 0x1f)) + 1;
  local_24c = uVar148 & 0xfffffffe;
  iVar128 = uVar123 + 2;
  opt_b.lightmode = opt->lightmode;
  opt_b._1_3_ = *(undefined3 *)&opt->field_0x1;
  opt_b.num_threads = opt->num_threads;
  opt_b.workspace_allocator = opt->workspace_allocator;
  opt_b.openmp_blocktime = opt->openmp_blocktime;
  opt_b.use_winograd_convolution = opt->use_winograd_convolution;
  opt_b.use_sgemm_convolution = opt->use_sgemm_convolution;
  opt_b.use_int8_inference = opt->use_int8_inference;
  opt_b.use_vulkan_compute = opt->use_vulkan_compute;
  opt_b.use_bf16_storage = opt->use_bf16_storage;
  opt_b.use_fp16_packed = opt->use_fp16_packed;
  opt_b.use_fp16_storage = opt->use_fp16_storage;
  opt_b.use_fp16_arithmetic = opt->use_fp16_arithmetic;
  opt_b.use_int8_packed = opt->use_int8_packed;
  opt_b.use_int8_storage = opt->use_int8_storage;
  opt_b.use_int8_arithmetic = opt->use_int8_arithmetic;
  opt_b.use_packing_layout = opt->use_packing_layout;
  opt_b.use_shader_pack8 = opt->use_shader_pack8;
  opt_b.use_subgroup_basic = opt->use_subgroup_basic;
  opt_b.use_subgroup_vote = opt->use_subgroup_vote;
  opt_b.use_subgroup_ballot = opt->use_subgroup_ballot;
  opt_b.use_subgroup_shuffle = opt->use_subgroup_shuffle;
  opt_b.use_image_storage = opt->use_image_storage;
  opt_b.use_tensor_storage = opt->use_tensor_storage;
  opt_b.use_reserved_0 = opt->use_reserved_0;
  auVar168._0_4_ = opt->flush_denormals;
  auVar168[4] = opt->use_local_pool_allocator;
  auVar168[5] = opt->use_shader_local_memory;
  auVar168[6] = opt->use_cooperative_matrix;
  auVar168[7] = opt->use_winograd23_convolution;
  auVar168[8] = opt->use_winograd43_convolution;
  auVar168[9] = opt->use_winograd63_convolution;
  auVar168[10] = opt->use_a53_a55_optimized_kernel;
  auVar168[0xb] = opt->use_reserved_7;
  auVar168[0xc] = opt->use_reserved_8;
  auVar168[0xd] = opt->use_reserved_9;
  auVar168[0xe] = opt->use_reserved_10;
  auVar168[0xf] = opt->use_reserved_11;
  opt_b.blob_allocator = opt->workspace_allocator;
  local_300 = kernel_tm;
  local_1a8.dims = uVar78;
  local_1a8.w = uVar79;
  local_1a8.c = _c;
  local_150 = top_blob;
  opt_b._48_16_ = auVar168;
  copy_make_border(bottom_blob,&local_1a8,0,(local_24c - bottom_blob->h) + 2,0,
                   iVar128 - bottom_blob->w,0,0.0,&opt_b);
  uVar145 = (int)uVar145 >> 1;
  uVar148 = (int)uVar148 >> 1;
  local_248.cstep = 0;
  uVar123 = uVar148 * uVar145;
  local_248.data = (void *)0x0;
  local_248.refcount._0_4_ = 0;
  local_248.refcount._4_4_ = 0;
  local_248.elemsize = 0;
  local_248.elempack = 0;
  local_248.allocator = (Allocator *)0x0;
  local_248.dims = 0;
  local_248.w = 0;
  local_248.h = 0;
  local_248.d = 0;
  local_248.c = 0;
  Mat::create(&local_248,0x10,uVar123,_c,2,opt->workspace_allocator);
  auVar152 = _DAT_00596070;
  uVar125 = (ulong)_c;
  if (0 < (int)_c) {
    lVar130 = (long)iVar128;
    uVar132 = 1;
    if (1 < (int)uVar145) {
      uVar132 = uVar145;
    }
    uVar135 = 1;
    if (1 < (int)uVar148) {
      uVar135 = (ulong)uVar148;
    }
    uVar138 = 0;
    do {
      if (0 < (int)local_290) {
        pvVar146 = (void *)(local_248.cstep * local_248.elemsize * uVar138 + (long)local_248.data);
        uVar126 = 0;
        do {
          if (0 < (int)local_258) {
            puVar149 = (undefined4 *)
                       ((long)local_1a8.data +
                       (long)(iVar128 * 2 * (int)uVar126) +
                       local_1a8.cstep * local_1a8.elemsize * uVar138);
            puVar142 = (undefined4 *)((long)puVar149 + lVar130);
            puVar143 = (undefined4 *)((long)puVar142 + lVar130);
            puVar120 = (undefined4 *)(lVar130 + (long)puVar143);
            uVar136 = 0;
            do {
              auVar150 = _d3;
              uVar232 = *puVar149;
              auVar6[0xd] = 0;
              auVar6._0_13_ = auVar168._0_13_;
              auVar6[0xe] = auVar168[7];
              auVar29[0xc] = auVar168[6];
              auVar29._0_12_ = auVar168._0_12_;
              auVar29._13_2_ = auVar6._13_2_;
              auVar57[0xb] = 0;
              auVar57._0_11_ = auVar168._0_11_;
              auVar57._12_3_ = auVar29._12_3_;
              auVar65[10] = auVar168[5];
              auVar65._0_10_ = auVar168._0_10_;
              auVar65._11_4_ = auVar57._11_4_;
              auVar70[9] = 0;
              auVar70._0_9_ = auVar168._0_9_;
              auVar70._10_5_ = auVar65._10_5_;
              auVar75[8] = auVar168[4];
              auVar75._0_8_ = auVar168._0_8_;
              auVar75._9_6_ = auVar70._9_6_;
              auVar198._8_7_ = auVar75._8_7_;
              auVar198[7] = (char)((uint)uVar232 >> 0x18);
              auVar198[6] = auVar168[3];
              auVar198[5] = (char)((uint)uVar232 >> 0x10);
              auVar198[4] = auVar168[2];
              auVar198[3] = (char)((uint)uVar232 >> 8);
              auVar198[2] = auVar168[1];
              auVar198[0] = auVar168[0];
              auVar198[1] = (char)uVar232;
              auVar198[0xf] = 0;
              auVar199 = psraw(auVar198,8);
              uVar232 = *puVar142;
              auVar7[0xd] = 0;
              auVar7._0_13_ = in_XMM4._0_13_;
              auVar7[0xe] = in_XMM4[7];
              auVar30[0xc] = in_XMM4[6];
              auVar30._0_12_ = in_XMM4._0_12_;
              auVar30._13_2_ = auVar7._13_2_;
              auVar58[0xb] = 0;
              auVar58._0_11_ = in_XMM4._0_11_;
              auVar58._12_3_ = auVar30._12_3_;
              auVar66[10] = in_XMM4[5];
              auVar66._0_10_ = in_XMM4._0_10_;
              auVar66._11_4_ = auVar58._11_4_;
              auVar71[9] = 0;
              auVar71._0_9_ = in_XMM4._0_9_;
              auVar71._10_5_ = auVar66._10_5_;
              auVar76[8] = in_XMM4[4];
              auVar76._0_8_ = in_XMM4._0_8_;
              auVar76._9_6_ = auVar71._9_6_;
              auVar233._8_7_ = auVar76._8_7_;
              auVar233[7] = (char)((uint)uVar232 >> 0x18);
              auVar233[6] = in_XMM4[3];
              auVar233[5] = (char)((uint)uVar232 >> 0x10);
              auVar233[4] = in_XMM4[2];
              auVar233[3] = (char)((uint)uVar232 >> 8);
              auVar233[2] = in_XMM4[1];
              auVar233[0] = in_XMM4[0];
              auVar233[1] = (char)uVar232;
              auVar233[0xf] = 0;
              auVar234 = psraw(auVar233,8);
              uVar232 = *puVar143;
              auVar8[0xd] = 0;
              auVar8._0_13_ = in_XMM5._0_13_;
              auVar8[0xe] = in_XMM5[7];
              auVar31[0xc] = in_XMM5[6];
              auVar31._0_12_ = in_XMM5._0_12_;
              auVar31._13_2_ = auVar8._13_2_;
              auVar59[0xb] = 0;
              auVar59._0_11_ = in_XMM5._0_11_;
              auVar59._12_3_ = auVar31._12_3_;
              auVar67[10] = in_XMM5[5];
              auVar67._0_10_ = in_XMM5._0_10_;
              auVar67._11_4_ = auVar59._11_4_;
              auVar72[9] = 0;
              auVar72._0_9_ = in_XMM5._0_9_;
              auVar72._10_5_ = auVar67._10_5_;
              auVar77[8] = in_XMM5[4];
              auVar77._0_8_ = in_XMM5._0_8_;
              auVar77._9_6_ = auVar72._9_6_;
              auVar241._8_7_ = auVar77._8_7_;
              auVar241[7] = (char)((uint)uVar232 >> 0x18);
              auVar241[6] = in_XMM5[3];
              auVar241[5] = (char)((uint)uVar232 >> 0x10);
              auVar241[4] = in_XMM5[2];
              auVar241[3] = (char)((uint)uVar232 >> 8);
              auVar241[2] = in_XMM5[1];
              auVar241[0] = in_XMM5[0];
              auVar241[1] = (char)uVar232;
              auVar241[0xf] = 0;
              auVar242 = psraw(auVar241,8);
              uVar232 = *puVar120;
              uVar192 = (undefined1)((uint)uVar232 >> 0x18);
              uVar190 = (undefined1)((uint)uVar232 >> 0x10);
              uVar189 = (undefined1)((uint)uVar232 >> 8);
              auVar167._4_4_ =
                   (int)(CONCAT35(CONCAT21(CONCAT11(uVar192,uVar192),uVar190),
                                  CONCAT14(uVar190,uVar232)) >> 0x20);
              auVar167[3] = uVar189;
              auVar167[2] = uVar189;
              auVar167[0] = (undefined1)uVar232;
              auVar167[1] = auVar167[0];
              auVar167._8_8_ = 0;
              auVar168 = psraw(auVar167,8);
              sVar194 = auVar242._0_2_;
              auVar203._0_2_ = auVar199._0_2_ - sVar194;
              sVar251 = auVar242._2_2_;
              uVar222 = auVar199._2_2_ - sVar251;
              sVar252 = auVar242._4_2_;
              sVar224 = auVar199._4_2_ - sVar252;
              sVar254 = auVar242._6_2_;
              sVar227 = auVar199._6_2_ - sVar254;
              uVar232 = CONCAT22(sVar227,sVar224);
              uVar230 = auVar199._10_2_ - auVar242._10_2_;
              sVar269 = auVar234._0_2_;
              auVar271._0_2_ = sVar269 + sVar194;
              sVar270 = auVar234._2_2_;
              auVar271._2_2_ = sVar270 + sVar251;
              sVar272 = auVar234._4_2_;
              auVar271._4_2_ = sVar272 + sVar252;
              sVar273 = auVar234._6_2_;
              auVar271._6_2_ = sVar273 + sVar254;
              auVar271._8_2_ = auVar234._8_2_ + auVar242._8_2_;
              auVar271._10_2_ = auVar234._10_2_ + auVar242._10_2_;
              sVar251 = sVar251 - sVar270;
              uVar240 = CONCAT22(sVar251,sVar194 - sVar269);
              sVar254 = sVar254 - sVar273;
              auVar169._0_2_ = auVar168._0_2_ - sVar269;
              auVar169._2_2_ = auVar168._2_2_ - sVar270;
              auVar169._4_2_ = auVar168._4_2_ - sVar272;
              auVar169._6_2_ = auVar168._6_2_ - sVar273;
              auVar169._8_2_ = auVar168._8_2_ - auVar234._8_2_;
              auVar169._10_2_ = auVar168._10_2_ - auVar234._10_2_;
              auVar169._12_2_ = auVar168._12_2_ - auVar234._12_2_;
              auVar169._14_2_ = auVar168._14_2_ - auVar234._14_2_;
              auVar274._2_2_ = 0;
              auVar274._0_2_ = uVar222;
              auVar274._4_2_ = sVar227;
              auVar274._6_2_ = 0;
              auVar274._8_4_ = (uint)(((ulong)uVar230 << 0x30) >> 0x30);
              auVar255._0_8_ = CONCAT44(uVar232,uVar232);
              auVar255._8_4_ = uVar232;
              uVar118 = CONCAT24(auVar271._6_2_,CONCAT22(sVar227,uVar230));
              auVar117._2_4_ = (int)((uint6)uVar118 >> 0x10);
              auVar117._0_2_ = auVar271._4_2_;
              auVar117._6_6_ = 0;
              auVar114._2_2_ = auVar271._2_2_;
              auVar114._0_2_ = sVar224;
              auVar114._4_8_ = SUB128(auVar117 << 0x30,4);
              auVar80._2_10_ = auVar114._2_10_;
              auVar80._0_2_ = uVar222;
              auVar200._0_8_ = auVar80._0_8_ << 0x20;
              auVar274 = auVar271 & SUB1612(ZEXT416(0xffff0000),0) | auVar274;
              auVar259._12_2_ = sVar227;
              auVar259._0_12_ = auVar255;
              auVar259._14_2_ = auVar271._6_2_;
              auVar258._12_4_ = auVar259._12_4_;
              auVar258._0_10_ = auVar255._0_10_;
              auVar258._10_2_ = auVar271._4_2_;
              auVar257._10_6_ = auVar258._10_6_;
              auVar257._8_2_ = sVar224;
              auVar257._0_8_ = auVar255._0_8_;
              auVar256._8_8_ = auVar257._8_8_;
              auVar256._6_2_ = auVar271._6_2_;
              auVar256._4_2_ = sVar227;
              auVar256._0_4_ = uVar232;
              auVar260._0_8_ = auVar256._4_8_ << 0x20;
              uVar232 = CONCAT22(auVar271._6_2_,sVar227);
              uVar253 = (uint)(CONCAT26(sVar254,CONCAT24(sVar252 - sVar272,uVar240)) >> 0x20);
              auVar200._8_4_ = auVar80._0_4_;
              auVar200._12_4_ = uVar253;
              auVar234._4_8_ = auVar200._8_8_;
              auVar234._0_4_ = uVar240;
              auVar234._12_4_ = 0;
              auVar199._4_4_ = uVar253 >> 0x10;
              auVar199._0_4_ = auVar274._4_4_;
              auVar199._8_8_ = 0;
              auVar260._8_4_ = auVar256._4_4_;
              auVar260._12_4_ = uVar253;
              auVar242._4_8_ = auVar260._8_8_;
              auVar242._0_4_ = uVar253;
              auVar242._12_4_ = 0;
              auVar202._0_12_ = SUB1612(auVar234 << 0x20,0);
              auVar202._12_2_ = sVar251;
              auVar202._14_2_ = auVar169._6_2_;
              auVar201._12_4_ = auVar202._12_4_;
              auVar201._0_10_ = SUB1610(auVar234 << 0x20,0);
              auVar201._10_2_ = auVar169._4_2_;
              auVar115._4_2_ = sVar194 - sVar269;
              auVar115._0_4_ = uVar240;
              auVar115._6_6_ = auVar201._10_6_;
              auVar81._4_8_ = auVar115._4_8_;
              auVar81._2_2_ = auVar169._2_2_;
              auVar81._0_2_ = auVar271._0_2_;
              auVar203._2_2_ = auVar169._0_2_;
              auVar203._8_4_ = auVar115._4_4_;
              auVar203._4_4_ = auVar201._12_4_;
              auVar203._12_4_ = auVar81._0_4_;
              auVar168 = pshufhw(auVar203,auVar203,0xe8);
              auVar204._0_4_ = auVar168._0_4_;
              auVar204._8_4_ = auVar168._8_4_;
              auVar204._12_4_ = auVar168._12_4_;
              auVar204._4_4_ = auVar204._8_4_;
              auVar234 = pshuflw(auVar204,auVar204,0x6c);
              auVar276._0_12_ = SUB1612(auVar199 << 0x40,0);
              auVar276._12_2_ = 0;
              auVar276._14_2_ = auVar169._6_2_;
              auVar275._12_4_ = auVar276._12_4_;
              auVar275._0_10_ = SUB1610(auVar199 << 0x40,0);
              auVar275._10_2_ = auVar169._4_2_;
              uVar83 = CONCAT62(auVar275._10_6_,sVar251);
              auVar82._4_8_ = uVar83;
              auVar82._2_2_ = auVar169._2_2_;
              auVar82._0_2_ = auVar274._2_2_;
              auVar243._14_2_ = auVar169._0_2_;
              auVar243._12_2_ = auVar274._0_2_;
              auVar243._4_4_ = auVar82._0_4_;
              auVar243._0_4_ = auVar275._12_4_;
              auVar243._8_4_ = (int)uVar83;
              auVar168 = pshufhw(auVar243,auVar243,0xe8);
              auVar244._4_4_ = auVar168._4_4_;
              auVar244._8_4_ = auVar168._8_4_;
              auVar244._12_4_ = auVar168._12_4_;
              auVar244._0_4_ = auVar244._8_4_;
              in_XMM5 = pshuflw(auVar244,auVar244,0xc9);
              auVar263._0_12_ = SUB1612(auVar242 << 0x20,0);
              auVar263._12_2_ = sVar254;
              auVar263._14_2_ = auVar169._6_2_;
              auVar262._12_4_ = auVar263._12_4_;
              auVar262._0_10_ = SUB1610(auVar242 << 0x20,0);
              auVar262._10_2_ = auVar169._4_2_;
              auVar116._4_2_ = sVar252 - sVar272;
              auVar116._0_4_ = uVar253;
              auVar116._6_6_ = auVar262._10_6_;
              auVar261._8_8_ = auVar116._4_8_;
              auVar261._6_2_ = auVar169._2_2_;
              auVar261._4_2_ = auVar271._4_2_;
              auVar261._2_2_ = auVar169._0_2_;
              auVar261._0_2_ = sVar224;
              auVar199 = pshuflw(auVar261,auVar261,0xe8);
              in_XMM4 = ZEXT616(CONCAT24(sVar254,uVar232)) & auVar152;
              auVar242 = ~auVar152 & auVar169 | in_XMM4;
              sVar252 = auVar199._0_2_;
              sVar196 = auVar234._0_2_ - sVar252;
              sVar254 = auVar199._2_2_;
              sVar223 = auVar234._2_2_ - sVar254;
              sVar269 = auVar199._8_2_;
              sVar225 = auVar234._4_2_ - sVar269;
              sVar270 = auVar199._10_2_;
              sVar228 = auVar234._6_2_ - sVar270;
              auVar168._8_2_ = auVar234._8_2_ - sVar269;
              auVar168._0_2_ = sVar196;
              auVar168._2_2_ = sVar223;
              auVar168._4_2_ = sVar225;
              auVar168._6_2_ = sVar228;
              auVar168._10_2_ = auVar234._10_2_ - sVar270;
              auVar168._12_2_ = auVar234._12_2_ - auVar199._12_2_;
              auVar168._14_2_ = auVar234._14_2_ - auVar199._14_2_;
              d0[0] = sVar196;
              d0[1] = sVar223;
              d0[2] = sVar225;
              d0[3] = sVar228;
              sVar224 = in_XMM5._0_2_;
              sVar166 = sVar224 + sVar252;
              sVar227 = in_XMM5._2_2_;
              sVar191 = sVar227 + sVar254;
              sVar194 = in_XMM5._4_2_;
              sVar193 = sVar194 + sVar269;
              sVar251 = in_XMM5._6_2_;
              sVar195 = sVar251 + sVar270;
              d1[0] = sVar166;
              d1[1] = sVar191;
              d1[2] = sVar193;
              d1[3] = sVar195;
              d2[1] = sVar254 - sVar227;
              d2[0] = sVar252 - sVar224;
              d2[2] = sVar269 - sVar194;
              d2[3] = sVar270 - sVar251;
              d3[1] = auVar242._2_2_ - sVar227;
              d3[0] = auVar242._0_2_ - sVar224;
              d3[2] = auVar242._4_2_ - sVar194;
              d3[3] = auVar242._6_2_ - sVar251;
              aiStack_f0 = auVar150._8_8_;
              lVar121 = 0;
              do {
                *(undefined2 *)((long)pvVar146 + lVar121) = *(undefined2 *)((long)d0 + lVar121);
                *(undefined2 *)((long)pvVar146 + lVar121 + 8) = *(undefined2 *)((long)d1 + lVar121);
                *(undefined2 *)((long)pvVar146 + lVar121 + 0x10) =
                     *(undefined2 *)((long)d2 + lVar121);
                *(undefined2 *)((long)pvVar146 + lVar121 + 0x18) =
                     *(undefined2 *)((long)d3 + lVar121);
                lVar121 = lVar121 + 2;
              } while (lVar121 != 8);
              puVar149 = (undefined4 *)((long)puVar149 + 2);
              puVar142 = (undefined4 *)((long)puVar142 + 2);
              puVar143 = (undefined4 *)((long)puVar143 + 2);
              puVar120 = (undefined4 *)((long)puVar120 + 2);
              pvVar146 = (void *)((long)pvVar146 + 0x20);
              uVar136 = uVar136 + 1;
            } while (uVar136 != uVar132);
          }
          uVar126 = uVar126 + 1;
        } while (uVar126 != uVar135);
      }
      uVar138 = uVar138 + 1;
    } while (uVar138 != uVar125);
  }
  piVar4 = (int *)CONCAT44(local_1a8.refcount._4_4_,local_1a8.refcount._0_4_);
  if (piVar4 != (int *)0x0) {
    LOCK();
    *piVar4 = *piVar4 + -1;
    UNLOCK();
    if (*piVar4 == 0) {
      if (local_1a8.allocator == (Allocator *)0x0) {
        if (local_1a8.data != (void *)0x0) {
          free(local_1a8.data);
        }
      }
      else {
        (*(local_1a8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  local_1a8.cstep = 0;
  local_1a8.data = (void *)0x0;
  local_1a8.refcount._0_4_ = 0;
  local_1a8.refcount._4_4_ = 0;
  local_1a8.elemsize = 0;
  local_1a8.elempack = 0;
  local_1a8.h = 0;
  local_1a8.d = 0;
  local_1a8.c = 0;
  local_1a8.allocator = (Allocator *)0x0;
  local_1a8.dims = 0;
  local_1a8.w = 0;
  d0[0] = 0;
  d0[1] = 0;
  d0[2] = 0;
  d0[3] = 0;
  Mat::create((Mat *)d0,0x10,uVar123,iVar3,4,opt->workspace_allocator);
  local_298 = uVar119 & 0xfffffffffffffffc;
  local_158 = (ulong)uVar123;
  if (0 < iVar3 >> 2) {
    local_378 = local_300->data;
    local_2c0 = local_300->elemsize;
    local_2a0 = (void *)(ulong)(uint)(iVar3 >> 2);
    lVar130 = local_300->cstep * local_2c0;
    local_2a8 = (short  [4])(lVar130 * 4);
    local_140 = local_2c0 * 4;
    local_2d0 = (void *)((long)local_378 + lVar130);
    local_2d8 = (void *)((long)local_378 + lVar130 * 2);
    local_2e0 = (void *)(lVar130 * 3 + (long)local_378);
    local_2b8 = 0;
    local_2f0[0] = d0[0];
    local_2f0[1] = d0[1];
    local_2f0[2] = d0[2];
    local_2f0[3] = d0[3];
    local_2b0 = 0;
    local_2f8[0] = d0[0];
    local_2f8[1] = d0[1];
    local_2f8[2] = d0[2];
    local_2f8[3] = d0[3];
    local_2e8[0] = d0[0];
    local_2e8[1] = d0[1];
    local_2e8[2] = d0[2];
    local_2e8[3] = d0[3];
    pvVar146 = (void *)0x0;
    do {
      local_288 = pvVar146;
      if (0 < (int)uVar123) {
        iVar128 = local_300->w;
        local_260 = 0;
        local_268 = (void *)local_248.elemsize;
        lVar131 = local_248.cstep * local_248.elemsize;
        lVar121 = lVar131 * 4;
        local_270 = (void *)((long)local_248.data + lVar131);
        local_278 = (void *)((long)local_248.data + lVar131 * 2);
        local_2c8 = local_248.data;
        local_280 = (void *)(lVar131 * 3 + (long)local_248.data);
        lVar124 = (long)iVar128 * local_2c0;
        local_368 = (void *)0x0;
        local_370 = 0;
        uVar135 = 0;
        do {
          uVar138 = 0;
          local_318 = 0;
          iStack_314 = 0;
          iStack_310 = 0;
          uStack_30c = 0;
          local_328 = (Allocator *)0x0;
          iStack_320 = 0;
          iStack_31c = 0;
          local_338 = 0;
          iStack_330 = 0;
          uStack_32c = 0;
          d1[0] = 0;
          d1[1] = 0;
          d1[2] = 0;
          d1[3] = 0;
          aiStack_340[0] = 0;
          aiStack_340[1] = 0;
          local_108 = (undefined1  [16])0x0;
          local_118 = (undefined1  [16])0x0;
          local_128 = (undefined1  [16])0x0;
          _d2 = (undefined1  [16])0x0;
          local_c8 = (undefined1  [16])0x0;
          local_d8 = (undefined1  [16])0x0;
          local_e8 = (undefined1  [16])0x0;
          _d3 = (undefined1  [16])0x0;
          sum3[0xc] = 0;
          sum3[0xd] = 0;
          sum3[0xe] = 0;
          sum3[0xf] = 0;
          sum3[8] = 0;
          sum3[9] = 0;
          sum3[10] = 0;
          sum3[0xb] = 0;
          sum3[4] = 0;
          sum3[5] = 0;
          sum3[6] = 0;
          sum3[7] = 0;
          sum3[0] = 0;
          sum3[1] = 0;
          sum3[2] = 0;
          sum3[3] = 0;
          if (3 < (int)_c) {
            lVar139 = local_248.w * local_370;
            pvVar146 = (void *)((long)local_248.data + lVar139);
            pvVar133 = (void *)((long)local_270 + lVar139);
            pvVar137 = (void *)((long)local_278 + lVar139);
            pvVar140 = (void *)(lVar139 + (long)local_280);
            uVar126 = 0;
            pvVar129 = local_378;
            do {
              lVar139 = 0;
              do {
                uVar138 = *(ulong *)((long)pvVar146 + lVar139);
                uVar163 = (undefined2)(uVar138 >> 0x30);
                auVar152._8_4_ = 0;
                auVar152._0_8_ = uVar138;
                auVar152._12_2_ = uVar163;
                auVar152._14_2_ = uVar163;
                uVar163 = (undefined2)(uVar138 >> 0x20);
                auVar151._12_4_ = auVar152._12_4_;
                auVar151._8_2_ = 0;
                auVar151._0_8_ = uVar138;
                auVar151._10_2_ = uVar163;
                auVar150._10_6_ = auVar151._10_6_;
                auVar150._8_2_ = uVar163;
                auVar150._0_8_ = uVar138;
                uVar163 = (undefined2)(uVar138 >> 0x10);
                auVar84._4_8_ = auVar150._8_8_;
                auVar84._2_2_ = uVar163;
                auVar84._0_2_ = uVar163;
                auVar153._0_4_ = (int)(short)uVar138;
                auVar153._4_4_ = auVar84._0_4_ >> 0x10;
                auVar153._8_4_ = auVar150._8_4_ >> 0x10;
                auVar153._12_4_ = auVar151._12_4_ >> 0x10;
                uVar138 = *(ulong *)((long)pvVar129 + lVar139);
                auVar9._8_4_ = 0;
                auVar9._0_8_ = uVar138;
                auVar9._12_2_ = (short)(uVar138 >> 0x30);
                auVar32._8_2_ = (short)(uVar138 >> 0x20);
                auVar32._0_8_ = uVar138;
                auVar32._10_4_ = auVar9._10_4_;
                auVar85._6_8_ = 0;
                auVar85._0_6_ = auVar32._8_6_;
                auVar68._4_2_ = (short)(uVar138 >> 0x10);
                auVar68._0_4_ = (uint)uVar138;
                auVar68._6_8_ = SUB148(auVar85 << 0x40,6);
                auVar205._0_4_ = (uint)uVar138 & 0xffff;
                auVar205._4_10_ = auVar68._4_10_;
                auVar205._14_2_ = 0;
                auVar168 = pmaddwd(auVar205,auVar153);
                iVar197 = auVar168._0_4_ + *(int *)(d1 + lVar139);
                iVar226 = auVar168._4_4_ + *(int *)(d1 + lVar139 + 2);
                iVar229 = auVar168._8_4_ + *(int *)((long)aiStack_340 + lVar139 * 2);
                iVar231 = auVar168._12_4_ + *(int *)((long)aiStack_340 + lVar139 * 2 + 4);
                *(int *)(d1 + lVar139) = iVar197;
                *(int *)(d1 + lVar139 + 2) = iVar226;
                *(int *)((long)aiStack_340 + lVar139 * 2) = iVar229;
                *(int *)((long)aiStack_340 + lVar139 * 2 + 4) = iVar231;
                uVar138 = *(ulong *)((long)pvVar133 + lVar139);
                uVar163 = (undefined2)(uVar138 >> 0x30);
                auVar172._8_4_ = 0;
                auVar172._0_8_ = uVar138;
                auVar172._12_2_ = uVar163;
                auVar172._14_2_ = uVar163;
                uVar163 = (undefined2)(uVar138 >> 0x20);
                auVar171._12_4_ = auVar172._12_4_;
                auVar171._8_2_ = 0;
                auVar171._0_8_ = uVar138;
                auVar171._10_2_ = uVar163;
                auVar170._10_6_ = auVar171._10_6_;
                auVar170._8_2_ = uVar163;
                auVar170._0_8_ = uVar138;
                uVar163 = (undefined2)(uVar138 >> 0x10);
                auVar86._4_8_ = auVar170._8_8_;
                auVar86._2_2_ = uVar163;
                auVar86._0_2_ = uVar163;
                auVar173._0_4_ = (int)(short)uVar138;
                auVar173._4_4_ = auVar86._0_4_ >> 0x10;
                auVar173._8_4_ = auVar170._8_4_ >> 0x10;
                auVar173._12_4_ = auVar171._12_4_ >> 0x10;
                uVar138 = *(ulong *)((long)pvVar129 + lVar139 + 0x20);
                auVar10._8_4_ = 0;
                auVar10._0_8_ = uVar138;
                auVar10._12_2_ = (short)(uVar138 >> 0x30);
                auVar33._8_2_ = (short)(uVar138 >> 0x20);
                auVar33._0_8_ = uVar138;
                auVar33._10_4_ = auVar10._10_4_;
                auVar87._6_8_ = 0;
                auVar87._0_6_ = auVar33._8_6_;
                auVar69._4_2_ = (short)(uVar138 >> 0x10);
                auVar69._0_4_ = (uint)uVar138;
                auVar69._6_8_ = SUB148(auVar87 << 0x40,6);
                auVar235._0_4_ = (uint)uVar138 & 0xffff;
                auVar235._4_10_ = auVar69._4_10_;
                auVar235._14_2_ = 0;
                auVar168 = pmaddwd(auVar235,auVar173);
                iVar197 = auVar168._0_4_ + iVar197;
                iVar226 = auVar168._4_4_ + iVar226;
                iVar229 = auVar168._8_4_ + iVar229;
                iVar231 = auVar168._12_4_ + iVar231;
                *(int *)(d1 + lVar139) = iVar197;
                *(int *)(d1 + lVar139 + 2) = iVar226;
                *(int *)((long)aiStack_340 + lVar139 * 2) = iVar229;
                *(int *)((long)aiStack_340 + lVar139 * 2 + 4) = iVar231;
                uVar138 = *(ulong *)((long)pvVar137 + lVar139);
                uVar163 = (undefined2)(uVar138 >> 0x30);
                auVar208._8_4_ = 0;
                auVar208._0_8_ = uVar138;
                auVar208._12_2_ = uVar163;
                auVar208._14_2_ = uVar163;
                uVar163 = (undefined2)(uVar138 >> 0x20);
                auVar207._12_4_ = auVar208._12_4_;
                auVar207._8_2_ = 0;
                auVar207._0_8_ = uVar138;
                auVar207._10_2_ = uVar163;
                auVar206._10_6_ = auVar207._10_6_;
                auVar206._8_2_ = uVar163;
                auVar206._0_8_ = uVar138;
                uVar163 = (undefined2)(uVar138 >> 0x10);
                auVar88._4_8_ = auVar206._8_8_;
                auVar88._2_2_ = uVar163;
                auVar88._0_2_ = uVar163;
                auVar209._0_4_ = (int)(short)uVar138;
                auVar209._4_4_ = auVar88._0_4_ >> 0x10;
                auVar209._8_4_ = auVar206._8_4_ >> 0x10;
                auVar209._12_4_ = auVar207._12_4_ >> 0x10;
                uVar138 = *(ulong *)((long)pvVar129 + lVar139 + 0x40);
                auVar11._8_4_ = 0;
                auVar11._0_8_ = uVar138;
                auVar11._12_2_ = (short)(uVar138 >> 0x30);
                auVar34._8_2_ = (short)(uVar138 >> 0x20);
                auVar34._0_8_ = uVar138;
                auVar34._10_4_ = auVar11._10_4_;
                auVar89._6_8_ = 0;
                auVar89._0_6_ = auVar34._8_6_;
                auVar245._6_8_ = SUB148(auVar89 << 0x40,6);
                auVar245._4_2_ = (short)(uVar138 >> 0x10);
                auVar245._0_2_ = (ushort)uVar138;
                auVar245._2_2_ = 0;
                auVar245._14_2_ = 0;
                auVar168 = pmaddwd(auVar245,auVar209);
                iVar197 = auVar168._0_4_ + iVar197;
                iVar226 = auVar168._4_4_ + iVar226;
                iVar229 = auVar168._8_4_ + iVar229;
                iVar231 = auVar168._12_4_ + iVar231;
                *(int *)(d1 + lVar139) = iVar197;
                *(int *)(d1 + lVar139 + 2) = iVar226;
                *(int *)((long)aiStack_340 + lVar139 * 2) = iVar229;
                *(int *)((long)aiStack_340 + lVar139 * 2 + 4) = iVar231;
                uVar138 = *(ulong *)((long)pvVar140 + lVar139);
                uVar163 = (undefined2)(uVar138 >> 0x30);
                auVar238._8_4_ = 0;
                auVar238._0_8_ = uVar138;
                auVar238._12_2_ = uVar163;
                auVar238._14_2_ = uVar163;
                uVar163 = (undefined2)(uVar138 >> 0x20);
                auVar237._12_4_ = auVar238._12_4_;
                auVar237._8_2_ = 0;
                auVar237._0_8_ = uVar138;
                auVar237._10_2_ = uVar163;
                auVar236._10_6_ = auVar237._10_6_;
                auVar236._8_2_ = uVar163;
                auVar236._0_8_ = uVar138;
                uVar163 = (undefined2)(uVar138 >> 0x10);
                auVar90._4_8_ = auVar236._8_8_;
                auVar90._2_2_ = uVar163;
                auVar90._0_2_ = uVar163;
                auVar239._0_4_ = (int)(short)uVar138;
                auVar239._4_4_ = auVar90._0_4_ >> 0x10;
                auVar239._8_4_ = auVar236._8_4_ >> 0x10;
                auVar239._12_4_ = auVar237._12_4_ >> 0x10;
                uVar138 = *(ulong *)((long)pvVar129 + lVar139 + 0x60);
                auVar12._8_4_ = 0;
                auVar12._0_8_ = uVar138;
                auVar12._12_2_ = (short)(uVar138 >> 0x30);
                auVar35._8_2_ = (short)(uVar138 >> 0x20);
                auVar35._0_8_ = uVar138;
                auVar35._10_4_ = auVar12._10_4_;
                auVar91._6_8_ = 0;
                auVar91._0_6_ = auVar35._8_6_;
                auVar264._6_8_ = SUB148(auVar91 << 0x40,6);
                auVar264._4_2_ = (short)(uVar138 >> 0x10);
                auVar264._0_2_ = (ushort)uVar138;
                auVar264._2_2_ = 0;
                auVar264._14_2_ = 0;
                auVar168 = pmaddwd(auVar264,auVar239);
                *(int *)(d1 + lVar139) = auVar168._0_4_ + iVar197;
                *(int *)(d1 + lVar139 + 2) = auVar168._4_4_ + iVar226;
                *(int *)((long)aiStack_340 + lVar139 * 2) = auVar168._8_4_ + iVar229;
                *(int *)((long)aiStack_340 + lVar139 * 2 + 4) = auVar168._12_4_ + iVar231;
                lVar141 = lVar130 + lVar139;
                uVar138 = *(ulong *)((long)pvVar129 + lVar130 + lVar139);
                auVar13._8_4_ = 0;
                auVar13._0_8_ = uVar138;
                auVar13._12_2_ = (short)(uVar138 >> 0x30);
                auVar36._8_2_ = (short)(uVar138 >> 0x20);
                auVar36._0_8_ = uVar138;
                auVar36._10_4_ = auVar13._10_4_;
                auVar92._6_8_ = 0;
                auVar92._0_6_ = auVar36._8_6_;
                auVar246._6_8_ = SUB148(auVar92 << 0x40,6);
                auVar246._4_2_ = (short)(uVar138 >> 0x10);
                auVar246._0_2_ = (ushort)uVar138;
                auVar246._2_2_ = 0;
                auVar246._14_2_ = 0;
                auVar168 = pmaddwd(auVar246,auVar153);
                iVar197 = auVar168._0_4_ + *(int *)(d2 + lVar139);
                iVar226 = auVar168._4_4_ + *(int *)(d2 + lVar139 + 2);
                iVar229 = auVar168._8_4_ + *(int *)((long)aiStack_130 + lVar139 * 2);
                iVar231 = auVar168._12_4_ + *(int *)(local_128 + lVar139 * 2 + -4);
                *(int *)(d2 + lVar139) = iVar197;
                *(int *)(d2 + lVar139 + 2) = iVar226;
                *(int *)((long)aiStack_130 + lVar139 * 2) = iVar229;
                *(int *)(local_128 + lVar139 * 2 + -4) = iVar231;
                uVar138 = *(ulong *)((long)pvVar129 + lVar130 + 0x20 + lVar139);
                auVar14._8_4_ = 0;
                auVar14._0_8_ = uVar138;
                auVar14._12_2_ = (short)(uVar138 >> 0x30);
                auVar37._8_2_ = (short)(uVar138 >> 0x20);
                auVar37._0_8_ = uVar138;
                auVar37._10_4_ = auVar14._10_4_;
                auVar93._6_8_ = 0;
                auVar93._0_6_ = auVar37._8_6_;
                auVar265._6_8_ = SUB148(auVar93 << 0x40,6);
                auVar265._4_2_ = (short)(uVar138 >> 0x10);
                auVar265._0_2_ = (ushort)uVar138;
                auVar265._2_2_ = 0;
                auVar265._14_2_ = 0;
                auVar168 = pmaddwd(auVar265,auVar173);
                iVar197 = auVar168._0_4_ + iVar197;
                iVar226 = auVar168._4_4_ + iVar226;
                iVar229 = auVar168._8_4_ + iVar229;
                iVar231 = auVar168._12_4_ + iVar231;
                *(int *)(d2 + lVar139) = iVar197;
                *(int *)(d2 + lVar139 + 2) = iVar226;
                *(int *)((long)aiStack_130 + lVar139 * 2) = iVar229;
                *(int *)(local_128 + lVar139 * 2 + -4) = iVar231;
                uVar138 = *(ulong *)((long)pvVar129 + lVar130 + 0x40 + lVar139);
                auVar15._8_4_ = 0;
                auVar15._0_8_ = uVar138;
                auVar15._12_2_ = (short)(uVar138 >> 0x30);
                auVar38._8_2_ = (short)(uVar138 >> 0x20);
                auVar38._0_8_ = uVar138;
                auVar38._10_4_ = auVar15._10_4_;
                auVar94._6_8_ = 0;
                auVar94._0_6_ = auVar38._8_6_;
                auVar247._6_8_ = SUB148(auVar94 << 0x40,6);
                auVar247._4_2_ = (short)(uVar138 >> 0x10);
                auVar247._0_2_ = (ushort)uVar138;
                auVar247._2_2_ = 0;
                auVar247._14_2_ = 0;
                auVar168 = pmaddwd(auVar247,auVar209);
                iVar197 = auVar168._0_4_ + iVar197;
                iVar226 = auVar168._4_4_ + iVar226;
                iVar229 = auVar168._8_4_ + iVar229;
                iVar231 = auVar168._12_4_ + iVar231;
                *(int *)(d2 + lVar139) = iVar197;
                *(int *)(d2 + lVar139 + 2) = iVar226;
                *(int *)((long)aiStack_130 + lVar139 * 2) = iVar229;
                *(int *)(local_128 + lVar139 * 2 + -4) = iVar231;
                uVar138 = *(ulong *)((long)pvVar129 + lVar130 + 0x60 + lVar139);
                auVar16._8_4_ = 0;
                auVar16._0_8_ = uVar138;
                auVar16._12_2_ = (short)(uVar138 >> 0x30);
                auVar39._8_2_ = (short)(uVar138 >> 0x20);
                auVar39._0_8_ = uVar138;
                auVar39._10_4_ = auVar16._10_4_;
                auVar95._6_8_ = 0;
                auVar95._0_6_ = auVar39._8_6_;
                auVar266._6_8_ = SUB148(auVar95 << 0x40,6);
                auVar266._4_2_ = (short)(uVar138 >> 0x10);
                auVar266._0_2_ = (ushort)uVar138;
                auVar266._2_2_ = 0;
                auVar266._14_2_ = 0;
                auVar168 = pmaddwd(auVar266,auVar239);
                *(int *)(d2 + lVar139) = auVar168._0_4_ + iVar197;
                *(int *)(d2 + lVar139 + 2) = auVar168._4_4_ + iVar226;
                *(int *)((long)aiStack_130 + lVar139 * 2) = auVar168._8_4_ + iVar229;
                *(int *)(local_128 + lVar139 * 2 + -4) = auVar168._12_4_ + iVar231;
                uVar138 = *(ulong *)((long)pvVar129 + lVar130 + lVar141);
                auVar17._8_4_ = 0;
                auVar17._0_8_ = uVar138;
                auVar17._12_2_ = (short)(uVar138 >> 0x30);
                auVar40._8_2_ = (short)(uVar138 >> 0x20);
                auVar40._0_8_ = uVar138;
                auVar40._10_4_ = auVar17._10_4_;
                auVar96._6_8_ = 0;
                auVar96._0_6_ = auVar40._8_6_;
                auVar248._6_8_ = SUB148(auVar96 << 0x40,6);
                auVar248._4_2_ = (short)(uVar138 >> 0x10);
                auVar248._0_2_ = (ushort)uVar138;
                auVar248._2_2_ = 0;
                auVar248._14_2_ = 0;
                auVar168 = pmaddwd(auVar248,auVar153);
                iVar197 = auVar168._0_4_ + *(int *)(d3 + lVar139);
                iVar226 = auVar168._4_4_ + *(int *)(d3 + lVar139 + 2);
                iVar229 = auVar168._8_4_ + *(int *)((long)aiStack_f0 + lVar139 * 2);
                iVar231 = auVar168._12_4_ + *(int *)(local_e8 + lVar139 * 2 + -4);
                lVar1 = lVar130 + lVar141;
                *(int *)(d3 + lVar139) = iVar197;
                *(int *)(d3 + lVar139 + 2) = iVar226;
                *(int *)((long)aiStack_f0 + lVar139 * 2) = iVar229;
                *(int *)(local_e8 + lVar139 * 2 + -4) = iVar231;
                uVar138 = *(ulong *)((long)pvVar129 + lVar130 + 0x20 + lVar141);
                auVar18._8_4_ = 0;
                auVar18._0_8_ = uVar138;
                auVar18._12_2_ = (short)(uVar138 >> 0x30);
                auVar41._8_2_ = (short)(uVar138 >> 0x20);
                auVar41._0_8_ = uVar138;
                auVar41._10_4_ = auVar18._10_4_;
                auVar97._6_8_ = 0;
                auVar97._0_6_ = auVar41._8_6_;
                auVar267._6_8_ = SUB148(auVar97 << 0x40,6);
                auVar267._4_2_ = (short)(uVar138 >> 0x10);
                auVar267._0_2_ = (ushort)uVar138;
                auVar267._2_2_ = 0;
                auVar267._14_2_ = 0;
                auVar168 = pmaddwd(auVar267,auVar173);
                iVar197 = auVar168._0_4_ + iVar197;
                iVar226 = auVar168._4_4_ + iVar226;
                iVar229 = auVar168._8_4_ + iVar229;
                iVar231 = auVar168._12_4_ + iVar231;
                *(int *)(d3 + lVar139) = iVar197;
                *(int *)(d3 + lVar139 + 2) = iVar226;
                *(int *)((long)aiStack_f0 + lVar139 * 2) = iVar229;
                *(int *)(local_e8 + lVar139 * 2 + -4) = iVar231;
                uVar138 = *(ulong *)((long)pvVar129 + lVar130 + 0x40 + lVar141);
                auVar19._8_4_ = 0;
                auVar19._0_8_ = uVar138;
                auVar19._12_2_ = (short)(uVar138 >> 0x30);
                auVar42._8_2_ = (short)(uVar138 >> 0x20);
                auVar42._0_8_ = uVar138;
                auVar42._10_4_ = auVar19._10_4_;
                auVar98._6_8_ = 0;
                auVar98._0_6_ = auVar42._8_6_;
                auVar249._6_8_ = SUB148(auVar98 << 0x40,6);
                auVar249._4_2_ = (short)(uVar138 >> 0x10);
                auVar249._0_2_ = (ushort)uVar138;
                auVar249._2_2_ = 0;
                auVar249._14_2_ = 0;
                auVar168 = pmaddwd(auVar249,auVar209);
                iVar197 = auVar168._0_4_ + iVar197;
                iVar226 = auVar168._4_4_ + iVar226;
                iVar229 = auVar168._8_4_ + iVar229;
                iVar231 = auVar168._12_4_ + iVar231;
                *(int *)(d3 + lVar139) = iVar197;
                *(int *)(d3 + lVar139 + 2) = iVar226;
                *(int *)((long)aiStack_f0 + lVar139 * 2) = iVar229;
                *(int *)(local_e8 + lVar139 * 2 + -4) = iVar231;
                uVar138 = *(ulong *)((long)pvVar129 + lVar130 + 0x60 + lVar141);
                auVar20._8_4_ = 0;
                auVar20._0_8_ = uVar138;
                auVar20._12_2_ = (short)(uVar138 >> 0x30);
                auVar43._8_2_ = (short)(uVar138 >> 0x20);
                auVar43._0_8_ = uVar138;
                auVar43._10_4_ = auVar20._10_4_;
                auVar99._6_8_ = 0;
                auVar99._0_6_ = auVar43._8_6_;
                auVar268._6_8_ = SUB148(auVar99 << 0x40,6);
                auVar268._4_2_ = (short)(uVar138 >> 0x10);
                auVar268._0_2_ = (ushort)uVar138;
                auVar268._2_2_ = 0;
                auVar268._14_2_ = 0;
                auVar168 = pmaddwd(auVar268,auVar239);
                *(int *)(d3 + lVar139) = auVar168._0_4_ + iVar197;
                *(int *)(d3 + lVar139 + 2) = auVar168._4_4_ + iVar226;
                *(int *)((long)aiStack_f0 + lVar139 * 2) = auVar168._8_4_ + iVar229;
                *(int *)(local_e8 + lVar139 * 2 + -4) = auVar168._12_4_ + iVar231;
                uVar138 = *(ulong *)((long)pvVar129 + lVar130 + lVar1);
                auVar21._8_4_ = 0;
                auVar21._0_8_ = uVar138;
                auVar21._12_2_ = (short)(uVar138 >> 0x30);
                auVar44._8_2_ = (short)(uVar138 >> 0x20);
                auVar44._0_8_ = uVar138;
                auVar44._10_4_ = auVar21._10_4_;
                auVar100._6_8_ = 0;
                auVar100._0_6_ = auVar44._8_6_;
                auVar250._6_8_ = SUB148(auVar100 << 0x40,6);
                auVar250._4_2_ = (short)(uVar138 >> 0x10);
                auVar250._0_2_ = (ushort)uVar138;
                auVar250._2_2_ = 0;
                auVar250._14_2_ = 0;
                auVar168 = pmaddwd(auVar250,auVar153);
                lVar141 = lVar139 * 2;
                iVar197 = auVar168._0_4_ + *(int *)((long)sum3 + lVar141);
                iVar226 = auVar168._4_4_ + *(int *)((long)sum3 + lVar141 + 4);
                iVar229 = auVar168._8_4_ + *(int *)((long)sum3 + lVar141 + 8);
                iVar231 = auVar168._12_4_ + *(int *)((long)sum3 + lVar141 + 0xc);
                lVar141 = lVar139 * 2;
                *(int *)((long)sum3 + lVar141) = iVar197;
                *(int *)((long)sum3 + lVar141 + 4) = iVar226;
                *(int *)((long)sum3 + lVar141 + 8) = iVar229;
                *(int *)((long)sum3 + lVar141 + 0xc) = iVar231;
                uVar138 = *(ulong *)((long)pvVar129 + lVar130 + 0x20 + lVar1);
                auVar22._8_4_ = 0;
                auVar22._0_8_ = uVar138;
                auVar22._12_2_ = (short)(uVar138 >> 0x30);
                auVar45._8_2_ = (short)(uVar138 >> 0x20);
                auVar45._0_8_ = uVar138;
                auVar45._10_4_ = auVar22._10_4_;
                auVar101._6_8_ = 0;
                auVar101._0_6_ = auVar45._8_6_;
                auVar154._6_8_ = SUB148(auVar101 << 0x40,6);
                auVar154._4_2_ = (short)(uVar138 >> 0x10);
                auVar154._0_2_ = (ushort)uVar138;
                auVar154._2_2_ = 0;
                auVar154._14_2_ = 0;
                auVar168 = pmaddwd(auVar154,auVar173);
                iVar197 = auVar168._0_4_ + iVar197;
                iVar226 = auVar168._4_4_ + iVar226;
                iVar229 = auVar168._8_4_ + iVar229;
                iVar231 = auVar168._12_4_ + iVar231;
                lVar141 = lVar139 * 2;
                *(int *)((long)sum3 + lVar141) = iVar197;
                *(int *)((long)sum3 + lVar141 + 4) = iVar226;
                *(int *)((long)sum3 + lVar141 + 8) = iVar229;
                *(int *)((long)sum3 + lVar141 + 0xc) = iVar231;
                uVar138 = *(ulong *)((long)pvVar129 + lVar130 + 0x40 + lVar1);
                auVar23._8_4_ = 0;
                auVar23._0_8_ = uVar138;
                auVar23._12_2_ = (short)(uVar138 >> 0x30);
                auVar46._8_2_ = (short)(uVar138 >> 0x20);
                auVar46._0_8_ = uVar138;
                auVar46._10_4_ = auVar23._10_4_;
                auVar102._6_8_ = 0;
                auVar102._0_6_ = auVar46._8_6_;
                auVar174._6_8_ = SUB148(auVar102 << 0x40,6);
                auVar174._4_2_ = (short)(uVar138 >> 0x10);
                auVar174._0_2_ = (ushort)uVar138;
                auVar174._2_2_ = 0;
                auVar174._14_2_ = 0;
                auVar168 = pmaddwd(auVar174,auVar209);
                iVar197 = auVar168._0_4_ + iVar197;
                iVar226 = auVar168._4_4_ + iVar226;
                iVar229 = auVar168._8_4_ + iVar229;
                iVar231 = auVar168._12_4_ + iVar231;
                lVar141 = lVar139 * 2;
                *(int *)((long)sum3 + lVar141) = iVar197;
                *(int *)((long)sum3 + lVar141 + 4) = iVar226;
                *(int *)((long)sum3 + lVar141 + 8) = iVar229;
                *(int *)((long)sum3 + lVar141 + 0xc) = iVar231;
                uVar138 = *(ulong *)((long)pvVar129 + lVar130 + 0x60 + lVar1);
                auVar24._8_4_ = 0;
                auVar24._0_8_ = uVar138;
                auVar24._12_2_ = (short)(uVar138 >> 0x30);
                auVar47._8_2_ = (short)(uVar138 >> 0x20);
                auVar47._0_8_ = uVar138;
                auVar47._10_4_ = auVar24._10_4_;
                auVar103._6_8_ = 0;
                auVar103._0_6_ = auVar47._8_6_;
                auVar155._6_8_ = SUB148(auVar103 << 0x40,6);
                auVar155._4_2_ = (short)(uVar138 >> 0x10);
                auVar155._0_2_ = (ushort)uVar138;
                auVar155._2_2_ = 0;
                auVar155._14_2_ = 0;
                auVar168 = pmaddwd(auVar155,auVar239);
                lVar141 = lVar139 * 2;
                *(int *)((long)sum3 + lVar141) = auVar168._0_4_ + iVar197;
                *(int *)((long)sum3 + lVar141 + 4) = auVar168._4_4_ + iVar226;
                *(int *)((long)sum3 + lVar141 + 8) = auVar168._8_4_ + iVar229;
                *(int *)((long)sum3 + lVar141 + 0xc) = auVar168._12_4_ + iVar231;
                lVar139 = lVar139 + 8;
              } while (lVar139 != 0x20);
              uVar138 = uVar126 + 4;
              lVar139 = uVar126 + 7;
              pvVar146 = (void *)((long)pvVar146 + lVar121);
              pvVar129 = (void *)((long)pvVar129 + local_140 * iVar128);
              pvVar133 = (void *)((long)pvVar133 + lVar121);
              pvVar137 = (void *)((long)pvVar137 + lVar121);
              pvVar140 = (void *)((long)pvVar140 + lVar121);
              uVar126 = uVar138;
            } while (lVar139 < (int)_c);
          }
          if ((int)uVar138 < (int)_c) {
            uVar138 = uVar138 & 0xffffffff;
            lVar139 = (long)local_248.data + (long)local_248.w * (long)local_368 + lVar131 * uVar138
            ;
            lVar141 = lVar124 * uVar138;
            pvVar146 = (void *)((long)local_378 + lVar141);
            pvVar133 = (void *)((long)local_2d0 + lVar141);
            pvVar137 = (void *)((long)local_2d8 + lVar141);
            pvVar129 = (void *)(lVar141 + (long)local_2e0);
            do {
              lVar141 = 0;
              do {
                uVar126 = *(ulong *)(lVar139 + lVar141);
                uVar163 = (undefined2)(uVar126 >> 0x30);
                auVar158._8_4_ = 0;
                auVar158._0_8_ = uVar126;
                auVar158._12_2_ = uVar163;
                auVar158._14_2_ = uVar163;
                uVar163 = (undefined2)(uVar126 >> 0x20);
                auVar157._12_4_ = auVar158._12_4_;
                auVar157._8_2_ = 0;
                auVar157._0_8_ = uVar126;
                auVar157._10_2_ = uVar163;
                auVar156._10_6_ = auVar157._10_6_;
                auVar156._8_2_ = uVar163;
                auVar156._0_8_ = uVar126;
                uVar163 = (undefined2)(uVar126 >> 0x10);
                auVar104._4_8_ = auVar156._8_8_;
                auVar104._2_2_ = uVar163;
                auVar104._0_2_ = uVar163;
                auVar159._0_4_ = (int)(short)uVar126;
                auVar159._4_4_ = auVar104._0_4_ >> 0x10;
                auVar159._8_4_ = auVar156._8_4_ >> 0x10;
                auVar159._12_4_ = auVar157._12_4_ >> 0x10;
                uVar126 = *(ulong *)((long)pvVar146 + lVar141);
                auVar25._8_4_ = 0;
                auVar25._0_8_ = uVar126;
                auVar25._12_2_ = (short)(uVar126 >> 0x30);
                auVar48._8_2_ = (short)(uVar126 >> 0x20);
                auVar48._0_8_ = uVar126;
                auVar48._10_4_ = auVar25._10_4_;
                auVar105._6_8_ = 0;
                auVar105._0_6_ = auVar48._8_6_;
                auVar175._6_8_ = SUB148(auVar105 << 0x40,6);
                auVar175._4_2_ = (short)(uVar126 >> 0x10);
                auVar175._0_2_ = (ushort)uVar126;
                auVar175._2_2_ = 0;
                auVar175._14_2_ = 0;
                auVar168 = pmaddwd(auVar175,auVar159);
                iVar197 = *(int *)((long)aiStack_340 + lVar141 * 2);
                iVar226 = *(int *)((long)aiStack_340 + lVar141 * 2 + 4);
                *(int *)(d1 + lVar141) = auVar168._0_4_ + *(int *)(d1 + lVar141);
                *(int *)(d1 + lVar141 + 2) = auVar168._4_4_ + *(int *)(d1 + lVar141 + 2);
                *(int *)((long)aiStack_340 + lVar141 * 2) = auVar168._8_4_ + iVar197;
                *(int *)((long)aiStack_340 + lVar141 * 2 + 4) = auVar168._12_4_ + iVar226;
                uVar126 = *(ulong *)((long)pvVar133 + lVar141);
                auVar26._8_4_ = 0;
                auVar26._0_8_ = uVar126;
                auVar26._12_2_ = (short)(uVar126 >> 0x30);
                auVar49._8_2_ = (short)(uVar126 >> 0x20);
                auVar49._0_8_ = uVar126;
                auVar49._10_4_ = auVar26._10_4_;
                auVar106._6_8_ = 0;
                auVar106._0_6_ = auVar49._8_6_;
                auVar176._6_8_ = SUB148(auVar106 << 0x40,6);
                auVar176._4_2_ = (short)(uVar126 >> 0x10);
                auVar176._0_2_ = (ushort)uVar126;
                auVar176._2_2_ = 0;
                auVar176._14_2_ = 0;
                auVar168 = pmaddwd(auVar176,auVar159);
                iVar197 = *(int *)((long)aiStack_130 + lVar141 * 2);
                iVar226 = *(int *)(local_128 + lVar141 * 2 + -4);
                *(int *)(d2 + lVar141) = auVar168._0_4_ + *(int *)(d2 + lVar141);
                *(int *)(d2 + lVar141 + 2) = auVar168._4_4_ + *(int *)(d2 + lVar141 + 2);
                *(int *)((long)aiStack_130 + lVar141 * 2) = auVar168._8_4_ + iVar197;
                *(int *)(local_128 + lVar141 * 2 + -4) = auVar168._12_4_ + iVar226;
                uVar126 = *(ulong *)((long)pvVar137 + lVar141);
                auVar27._8_4_ = 0;
                auVar27._0_8_ = uVar126;
                auVar27._12_2_ = (short)(uVar126 >> 0x30);
                auVar50._8_2_ = (short)(uVar126 >> 0x20);
                auVar50._0_8_ = uVar126;
                auVar50._10_4_ = auVar27._10_4_;
                auVar107._6_8_ = 0;
                auVar107._0_6_ = auVar50._8_6_;
                auVar177._6_8_ = SUB148(auVar107 << 0x40,6);
                auVar177._4_2_ = (short)(uVar126 >> 0x10);
                auVar177._0_2_ = (ushort)uVar126;
                auVar177._2_2_ = 0;
                auVar177._14_2_ = 0;
                auVar168 = pmaddwd(auVar177,auVar159);
                iVar197 = *(int *)((long)aiStack_f0 + lVar141 * 2);
                iVar226 = *(int *)(local_e8 + lVar141 * 2 + -4);
                *(int *)(d3 + lVar141) = auVar168._0_4_ + *(int *)(d3 + lVar141);
                *(int *)(d3 + lVar141 + 2) = auVar168._4_4_ + *(int *)(d3 + lVar141 + 2);
                *(int *)((long)aiStack_f0 + lVar141 * 2) = auVar168._8_4_ + iVar197;
                *(int *)(local_e8 + lVar141 * 2 + -4) = auVar168._12_4_ + iVar226;
                uVar126 = *(ulong *)((long)pvVar129 + lVar141);
                auVar28._8_4_ = 0;
                auVar28._0_8_ = uVar126;
                auVar28._12_2_ = (short)(uVar126 >> 0x30);
                auVar51._8_2_ = (short)(uVar126 >> 0x20);
                auVar51._0_8_ = uVar126;
                auVar51._10_4_ = auVar28._10_4_;
                auVar108._6_8_ = 0;
                auVar108._0_6_ = auVar51._8_6_;
                auVar178._6_8_ = SUB148(auVar108 << 0x40,6);
                auVar178._4_2_ = (short)(uVar126 >> 0x10);
                auVar178._0_2_ = (ushort)uVar126;
                auVar178._2_2_ = 0;
                auVar178._14_2_ = 0;
                auVar168 = pmaddwd(auVar178,auVar159);
                lVar1 = lVar141 * 2;
                iVar197 = *(int *)((long)sum3 + lVar1 + 4);
                iVar226 = *(int *)((long)sum3 + lVar1 + 8);
                iVar229 = *(int *)((long)sum3 + lVar1 + 0xc);
                lVar2 = lVar141 * 2;
                *(int *)((long)sum3 + lVar2) = auVar168._0_4_ + *(int *)((long)sum3 + lVar1);
                *(int *)((long)sum3 + lVar2 + 4) = auVar168._4_4_ + iVar197;
                *(int *)((long)sum3 + lVar2 + 8) = auVar168._8_4_ + iVar226;
                *(int *)((long)sum3 + lVar2 + 0xc) = auVar168._12_4_ + iVar229;
                lVar141 = lVar141 + 8;
              } while (lVar141 != 0x20);
              uVar138 = uVar138 + 1;
              lVar139 = lVar139 + lVar131;
              pvVar146 = (void *)((long)pvVar146 + lVar124);
              pvVar133 = (void *)((long)pvVar133 + lVar124);
              pvVar137 = (void *)((long)pvVar137 + lVar124);
              pvVar129 = (void *)((long)pvVar129 + lVar124);
            } while (uVar138 != uVar125);
          }
          lVar139 = 0;
          do {
            *(undefined4 *)((long)d0 + lVar139) = *(undefined4 *)((long)d1 + lVar139);
            *(undefined4 *)((long)d0 + lVar139) = *(undefined4 *)((long)d2 + lVar139);
            *(undefined4 *)((long)d0 + lVar139) = *(undefined4 *)((long)d3 + lVar139);
            *(undefined4 *)((long)d0 + lVar139) = *(undefined4 *)((long)sum3 + lVar139);
            lVar139 = lVar139 + 4;
          } while (lVar139 != 0x40);
          uVar135 = uVar135 + 1;
          local_370 = local_370 + local_248.elemsize;
          local_368 = (void *)((long)local_368 + local_248.elemsize);
        } while (uVar135 != local_158);
      }
      local_378 = (void *)((long)local_378 + (long)local_2a8);
      local_2d0 = (void *)((long)local_2d0 + (long)local_2a8);
      local_2d8 = (void *)((long)local_2d8 + (long)local_2a8);
      local_2e0 = (void *)((long)local_2e0 + (long)local_2a8);
      pvVar146 = (void *)((long)local_288 + 1U);
    } while ((void *)((long)local_288 + 1U) != local_2a0);
  }
  if ((int)local_298 != iVar3) {
    local_368 = local_300->data;
    sVar5 = local_300->elemsize;
    local_2f0 = (short  [4])(local_300->cstep * sVar5);
    local_2f8[0] = 0;
    local_2f8[1] = 0;
    local_2f8[2] = 0;
    local_2f8[3] = 0;
    local_2a0 = (void *)0x0;
    local_2a8[0] = d0[0];
    local_2a8[1] = d0[1];
    local_2a8[2] = d0[2];
    local_2a8[3] = d0[3];
    local_3a8 = (void *)((long)local_2f0 * local_298 + (long)local_368);
    local_2b0 = sVar5 * 4;
    local_2b8 = sVar5 * 2;
    local_2c0 = sVar5 * 3;
    local_2e8 = (short  [4])(local_300->cstep * local_298);
    uVar135 = local_298;
    do {
      local_298 = uVar135;
      if (0 < (int)uVar123) {
        local_260 = (long)local_300->w;
        lVar124 = local_248.cstep * local_248.elemsize;
        local_2c8 = (void *)0x0;
        lVar130 = lVar124 * 4;
        lVar121 = local_2b0 * local_260;
        local_2d8 = (void *)((long)local_248.data + lVar124);
        local_2e0 = (void *)((long)local_3a8 + sVar5 * local_260);
        local_270 = (void *)((long)local_248.data + lVar124 * 2);
        local_278 = (void *)(local_2b8 * local_260 + (long)local_3a8);
        local_280 = (void *)(lVar124 * 3 + (long)local_248.data);
        local_288 = (void *)(local_2c0 * local_260 + (long)local_3a8);
        lVar131 = 0;
        local_390 = 0;
        uVar135 = 0;
        local_268 = local_248.data;
        local_2d0 = (void *)local_248.elemsize;
        do {
          uVar138 = 0;
          local_318 = 0;
          iStack_314 = 0;
          iStack_310 = 0;
          uStack_30c = 0;
          local_328 = (Allocator *)0x0;
          iStack_320 = 0;
          iStack_31c = 0;
          local_338 = 0;
          iStack_330 = 0;
          uStack_32c = 0;
          d1[0] = 0;
          d1[1] = 0;
          d1[2] = 0;
          d1[3] = 0;
          aiStack_340[0] = 0;
          aiStack_340[1] = 0;
          if (3 < (int)_c) {
            lVar139 = local_248.w * local_390;
            pvVar146 = (void *)((long)local_248.data + lVar139);
            pvVar133 = (void *)((long)local_2d8 + lVar139);
            pvVar137 = (void *)((long)local_270 + lVar139);
            pvVar127 = (void *)(lVar139 + (long)local_280);
            pvVar129 = local_2e0;
            uVar126 = 0;
            pvVar140 = local_278;
            pvVar144 = local_288;
            pvVar147 = local_3a8;
            do {
              lVar139 = 0;
              do {
                uVar138 = *(ulong *)((long)pvVar146 + lVar139);
                uVar134 = *(ulong *)((long)pvVar147 + lVar139);
                uVar163 = (undefined2)(uVar134 >> 0x30);
                auVar182._8_4_ = 0;
                auVar182._0_8_ = uVar134;
                auVar182._12_2_ = uVar163;
                auVar182._14_2_ = uVar163;
                uVar163 = (undefined2)(uVar134 >> 0x20);
                auVar181._12_4_ = auVar182._12_4_;
                auVar181._8_2_ = 0;
                auVar181._0_8_ = uVar134;
                auVar181._10_2_ = uVar163;
                auVar180._10_6_ = auVar181._10_6_;
                auVar180._8_2_ = uVar163;
                auVar180._0_8_ = uVar134;
                uVar163 = (undefined2)(uVar134 >> 0x10);
                auVar179._8_8_ = auVar180._8_8_;
                auVar179._6_2_ = uVar163;
                auVar179._4_2_ = uVar163;
                auVar179._0_2_ = (undefined2)uVar134;
                auVar179._2_2_ = auVar179._0_2_;
                auVar52._8_4_ = 0;
                auVar52._0_8_ = uVar138;
                auVar52._12_2_ = (short)(uVar138 >> 0x30);
                auVar60._8_2_ = (short)(uVar138 >> 0x20);
                auVar60._0_8_ = uVar138;
                auVar60._10_4_ = auVar52._10_4_;
                auVar109._6_8_ = 0;
                auVar109._0_6_ = auVar60._8_6_;
                auVar73._4_2_ = (short)(uVar138 >> 0x10);
                auVar73._0_4_ = (uint)uVar138;
                auVar73._6_8_ = SUB148(auVar109 << 0x40,6);
                auVar160._0_4_ = (uint)uVar138 & 0xffff;
                auVar160._4_10_ = auVar73._4_10_;
                auVar160._14_2_ = 0;
                auVar168 = pmaddwd(auVar160,auVar179);
                iVar128 = auVar168._0_4_ + *(int *)(d1 + lVar139);
                iVar197 = auVar168._4_4_ + *(int *)(d1 + lVar139 + 2);
                iVar226 = auVar168._8_4_ + *(int *)((long)aiStack_340 + lVar139 * 2);
                iVar229 = auVar168._12_4_ + *(int *)((long)aiStack_340 + lVar139 * 2 + 4);
                *(int *)(d1 + lVar139) = iVar128;
                *(int *)(d1 + lVar139 + 2) = iVar197;
                *(int *)((long)aiStack_340 + lVar139 * 2) = iVar226;
                *(int *)((long)aiStack_340 + lVar139 * 2 + 4) = iVar229;
                uVar138 = *(ulong *)((long)pvVar133 + lVar139);
                uVar134 = *(ulong *)((long)pvVar129 + lVar139);
                uVar163 = (undefined2)(uVar134 >> 0x30);
                auVar213._8_4_ = 0;
                auVar213._0_8_ = uVar134;
                auVar213._12_2_ = uVar163;
                auVar213._14_2_ = uVar163;
                uVar163 = (undefined2)(uVar134 >> 0x20);
                auVar212._12_4_ = auVar213._12_4_;
                auVar212._8_2_ = 0;
                auVar212._0_8_ = uVar134;
                auVar212._10_2_ = uVar163;
                auVar211._10_6_ = auVar212._10_6_;
                auVar211._8_2_ = uVar163;
                auVar211._0_8_ = uVar134;
                uVar163 = (undefined2)(uVar134 >> 0x10);
                auVar210._8_8_ = auVar211._8_8_;
                auVar210._6_2_ = uVar163;
                auVar210._4_2_ = uVar163;
                auVar210._0_2_ = (undefined2)uVar134;
                auVar210._2_2_ = auVar210._0_2_;
                auVar53._8_4_ = 0;
                auVar53._0_8_ = uVar138;
                auVar53._12_2_ = (short)(uVar138 >> 0x30);
                auVar61._8_2_ = (short)(uVar138 >> 0x20);
                auVar61._0_8_ = uVar138;
                auVar61._10_4_ = auVar53._10_4_;
                auVar110._6_8_ = 0;
                auVar110._0_6_ = auVar61._8_6_;
                auVar74._4_2_ = (short)(uVar138 >> 0x10);
                auVar74._0_4_ = (uint)uVar138;
                auVar74._6_8_ = SUB148(auVar110 << 0x40,6);
                auVar183._0_4_ = (uint)uVar138 & 0xffff;
                auVar183._4_10_ = auVar74._4_10_;
                auVar183._14_2_ = 0;
                auVar168 = pmaddwd(auVar183,auVar210);
                iVar128 = auVar168._0_4_ + iVar128;
                iVar197 = auVar168._4_4_ + iVar197;
                iVar226 = auVar168._8_4_ + iVar226;
                iVar229 = auVar168._12_4_ + iVar229;
                *(int *)(d1 + lVar139) = iVar128;
                *(int *)(d1 + lVar139 + 2) = iVar197;
                *(int *)((long)aiStack_340 + lVar139 * 2) = iVar226;
                *(int *)((long)aiStack_340 + lVar139 * 2 + 4) = iVar229;
                uVar138 = *(ulong *)((long)pvVar137 + lVar139);
                uVar134 = *(ulong *)((long)pvVar140 + lVar139);
                uVar163 = (undefined2)(uVar134 >> 0x30);
                auVar217._8_4_ = 0;
                auVar217._0_8_ = uVar134;
                auVar217._12_2_ = uVar163;
                auVar217._14_2_ = uVar163;
                uVar163 = (undefined2)(uVar134 >> 0x20);
                auVar216._12_4_ = auVar217._12_4_;
                auVar216._8_2_ = 0;
                auVar216._0_8_ = uVar134;
                auVar216._10_2_ = uVar163;
                auVar215._10_6_ = auVar216._10_6_;
                auVar215._8_2_ = uVar163;
                auVar215._0_8_ = uVar134;
                uVar163 = (undefined2)(uVar134 >> 0x10);
                auVar214._8_8_ = auVar215._8_8_;
                auVar214._6_2_ = uVar163;
                auVar214._4_2_ = uVar163;
                auVar214._0_2_ = (undefined2)uVar134;
                auVar214._2_2_ = auVar214._0_2_;
                auVar54._8_4_ = 0;
                auVar54._0_8_ = uVar138;
                auVar54._12_2_ = (short)(uVar138 >> 0x30);
                auVar62._8_2_ = (short)(uVar138 >> 0x20);
                auVar62._0_8_ = uVar138;
                auVar62._10_4_ = auVar54._10_4_;
                auVar111._6_8_ = 0;
                auVar111._0_6_ = auVar62._8_6_;
                auVar161._6_8_ = SUB148(auVar111 << 0x40,6);
                auVar161._4_2_ = (short)(uVar138 >> 0x10);
                auVar161._0_2_ = (ushort)uVar138;
                auVar161._2_2_ = 0;
                auVar161._14_2_ = 0;
                auVar168 = pmaddwd(auVar161,auVar214);
                iVar128 = auVar168._0_4_ + iVar128;
                iVar197 = auVar168._4_4_ + iVar197;
                iVar226 = auVar168._8_4_ + iVar226;
                iVar229 = auVar168._12_4_ + iVar229;
                *(int *)(d1 + lVar139) = iVar128;
                *(int *)(d1 + lVar139 + 2) = iVar197;
                *(int *)((long)aiStack_340 + lVar139 * 2) = iVar226;
                *(int *)((long)aiStack_340 + lVar139 * 2 + 4) = iVar229;
                uVar138 = *(ulong *)((long)pvVar127 + lVar139);
                uVar134 = *(ulong *)((long)pvVar144 + lVar139);
                uVar163 = (undefined2)(uVar134 >> 0x30);
                auVar221._8_4_ = 0;
                auVar221._0_8_ = uVar134;
                auVar221._12_2_ = uVar163;
                auVar221._14_2_ = uVar163;
                uVar163 = (undefined2)(uVar134 >> 0x20);
                auVar220._12_4_ = auVar221._12_4_;
                auVar220._8_2_ = 0;
                auVar220._0_8_ = uVar134;
                auVar220._10_2_ = uVar163;
                auVar219._10_6_ = auVar220._10_6_;
                auVar219._8_2_ = uVar163;
                auVar219._0_8_ = uVar134;
                uVar163 = (undefined2)(uVar134 >> 0x10);
                auVar218._8_8_ = auVar219._8_8_;
                auVar218._6_2_ = uVar163;
                auVar218._4_2_ = uVar163;
                auVar218._0_2_ = (undefined2)uVar134;
                auVar218._2_2_ = auVar218._0_2_;
                auVar55._8_4_ = 0;
                auVar55._0_8_ = uVar138;
                auVar55._12_2_ = (short)(uVar138 >> 0x30);
                auVar63._8_2_ = (short)(uVar138 >> 0x20);
                auVar63._0_8_ = uVar138;
                auVar63._10_4_ = auVar55._10_4_;
                auVar112._6_8_ = 0;
                auVar112._0_6_ = auVar63._8_6_;
                auVar184._6_8_ = SUB148(auVar112 << 0x40,6);
                auVar184._4_2_ = (short)(uVar138 >> 0x10);
                auVar184._0_2_ = (ushort)uVar138;
                auVar184._2_2_ = 0;
                auVar184._14_2_ = 0;
                auVar168 = pmaddwd(auVar184,auVar218);
                *(int *)(d1 + lVar139) = auVar168._0_4_ + iVar128;
                *(int *)(d1 + lVar139 + 2) = auVar168._4_4_ + iVar197;
                *(int *)((long)aiStack_340 + lVar139 * 2) = auVar168._8_4_ + iVar226;
                *(int *)((long)aiStack_340 + lVar139 * 2 + 4) = auVar168._12_4_ + iVar229;
                lVar139 = lVar139 + 8;
              } while (lVar139 != 0x20);
              uVar138 = uVar126 + 4;
              lVar139 = uVar126 + 7;
              pvVar146 = (void *)((long)pvVar146 + lVar130);
              pvVar147 = (void *)((long)pvVar147 + lVar121);
              pvVar133 = (void *)((long)pvVar133 + lVar130);
              pvVar129 = (void *)((long)pvVar129 + lVar121);
              pvVar137 = (void *)((long)pvVar137 + lVar130);
              pvVar140 = (void *)((long)pvVar140 + lVar121);
              pvVar127 = (void *)((long)pvVar127 + lVar130);
              pvVar144 = (void *)((long)pvVar144 + lVar121);
              uVar126 = uVar138;
            } while (lVar139 < (int)_c);
          }
          if ((int)uVar138 < (int)_c) {
            uVar138 = uVar138 & 0xffffffff;
            lVar139 = (long)local_248.data + local_248.w * lVar131 + lVar124 * uVar138;
            pvVar146 = (void *)((local_260 * uVar138 + (long)local_2e8) * sVar5 + (long)local_368);
            do {
              lVar141 = 0;
              do {
                uVar126 = *(ulong *)(lVar139 + lVar141 * 2);
                uVar134 = *(ulong *)((long)pvVar146 + lVar141 * 2);
                uVar163 = (undefined2)(uVar134 >> 0x30);
                auVar188._8_4_ = 0;
                auVar188._0_8_ = uVar134;
                auVar188._12_2_ = uVar163;
                auVar188._14_2_ = uVar163;
                uVar163 = (undefined2)(uVar134 >> 0x20);
                auVar187._12_4_ = auVar188._12_4_;
                auVar187._8_2_ = 0;
                auVar187._0_8_ = uVar134;
                auVar187._10_2_ = uVar163;
                auVar186._10_6_ = auVar187._10_6_;
                auVar186._8_2_ = uVar163;
                auVar186._0_8_ = uVar134;
                uVar163 = (undefined2)(uVar134 >> 0x10);
                auVar185._8_8_ = auVar186._8_8_;
                auVar185._6_2_ = uVar163;
                auVar185._4_2_ = uVar163;
                auVar185._0_2_ = (undefined2)uVar134;
                auVar185._2_2_ = auVar185._0_2_;
                auVar56._8_4_ = 0;
                auVar56._0_8_ = uVar126;
                auVar56._12_2_ = (short)(uVar126 >> 0x30);
                auVar64._8_2_ = (short)(uVar126 >> 0x20);
                auVar64._0_8_ = uVar126;
                auVar64._10_4_ = auVar56._10_4_;
                auVar113._6_8_ = 0;
                auVar113._0_6_ = auVar64._8_6_;
                auVar162._6_8_ = SUB148(auVar113 << 0x40,6);
                auVar162._4_2_ = (short)(uVar126 >> 0x10);
                auVar162._0_2_ = (ushort)uVar126;
                auVar162._2_2_ = 0;
                auVar162._14_2_ = 0;
                auVar168 = pmaddwd(auVar162,auVar185);
                iVar128 = *(int *)(d1 + lVar141 * 2 + 2);
                iVar197 = aiStack_340[lVar141];
                iVar226 = aiStack_340[lVar141 + 1];
                *(int *)(d1 + lVar141 * 2) = auVar168._0_4_ + *(int *)(d1 + lVar141 * 2);
                *(int *)(d1 + lVar141 * 2 + 2) = auVar168._4_4_ + iVar128;
                aiStack_340[lVar141] = auVar168._8_4_ + iVar197;
                aiStack_340[lVar141 + 1] = auVar168._12_4_ + iVar226;
                lVar141 = lVar141 + 4;
              } while (lVar141 != 0x10);
              uVar138 = uVar138 + 1;
              lVar139 = lVar139 + lVar124;
              pvVar146 = (void *)((long)pvVar146 + sVar5 * local_260);
            } while (uVar138 != uVar125);
          }
          *(ulong *)((long)d0 + 0x30) = CONCAT44(iStack_314,local_318);
          *(ulong *)((long)d0 + 0x38) = CONCAT44(uStack_30c,iStack_310);
          *(Allocator **)((long)d0 + 0x20) = local_328;
          *(ulong *)((long)d0 + 0x28) = CONCAT44(iStack_31c,iStack_320);
          *(size_t *)((long)d0 + 0x10) = local_338;
          *(ulong *)((long)d0 + 0x18) = CONCAT44(uStack_32c,iStack_330);
          *(short (*) [4])d0 = d1;
          *(ulong *)((long)d0 + 8) = CONCAT44(aiStack_340[1],aiStack_340[0]);
          uVar135 = uVar135 + 1;
          local_390 = local_390 + local_248.elemsize;
          lVar131 = lVar131 + local_248.elemsize;
        } while (uVar135 != local_158);
      }
      local_3a8 = (void *)((long)local_3a8 + (long)local_2f0);
      local_368 = (void *)((long)local_368 + (long)local_2f0);
      uVar135 = local_298 + 1;
    } while ((long)(local_298 + 1) < (long)uVar119);
  }
  piVar4 = (int *)CONCAT44(local_248.refcount._4_4_,local_248.refcount._0_4_);
  if (piVar4 != (int *)0x0) {
    LOCK();
    *piVar4 = *piVar4 + -1;
    UNLOCK();
    if (*piVar4 == 0) {
      if (local_248.allocator == (Allocator *)0x0) {
        if (local_248.data != (void *)0x0) {
          free(local_248.data);
        }
      }
      else {
        (*(local_248.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  local_248.cstep = 0;
  local_248.data = (void *)0x0;
  local_248.refcount._0_4_ = 0;
  local_248.refcount._4_4_ = 0;
  local_248.elemsize = 0;
  local_248.elempack = 0;
  local_248.h = 0;
  local_248.d = 0;
  local_248.c = 0;
  local_248.allocator = (Allocator *)0x0;
  local_248.dims = 0;
  local_248.w = 0;
  local_308 = 0;
  d1[0] = 0;
  d1[1] = 0;
  d1[2] = 0;
  d1[3] = 0;
  aiStack_340[0] = 0;
  aiStack_340[1] = 0;
  local_338 = 0;
  iStack_330 = 0;
  local_328 = (Allocator *)0x0;
  iStack_320 = 0;
  iStack_31c = 0;
  local_318 = 0;
  iStack_314 = 0;
  iStack_310 = 0;
  Mat::create((Mat *)d1,(int)local_148,local_24c,iVar3,4,opt->workspace_allocator);
  if (0 < iVar3) {
    uVar125 = 1;
    if (1 < (int)uVar145) {
      uVar125 = (ulong)uVar145;
    }
    uVar135 = 1;
    if (1 < (int)uVar148) {
      uVar135 = (ulong)uVar148;
    }
    uVar138 = 0;
    do {
      if (0 < (int)local_290) {
        uVar126 = 0;
        do {
          if (0 < (int)local_258) {
            puVar122 = (undefined8 *)
                       (local_308 * local_338 * uVar138 + (long)d1 +
                       uVar126 * (long)iStack_31c * local_338 * 2);
            uVar134 = uVar125;
            do {
              iVar3 = *(int *)((long)d0 + 0xc);
              iVar128 = *(int *)((long)d0 + 0x1c);
              iVar197 = *(int *)((long)d0 + 0x2c);
              iVar226 = *(int *)((long)d0 + 0x3c);
              iVar229 = *(int *)((long)d0 + 4) + *(int *)((long)d0 + 0x14) +
                        *(int *)((long)d0 + 0x24);
              iVar231 = *(int *)((long)d0 + 8) + *(int *)((long)d0 + 0x18) +
                        *(int *)((long)d0 + 0x28);
              iVar164 = (*(int *)((long)d0 + 0x14) - *(int *)((long)d0 + 0x24)) +
                        *(int *)((long)d0 + 0x34);
              iVar165 = (*(int *)((long)d0 + 0x18) - *(int *)((long)d0 + 0x28)) +
                        *(int *)((long)d0 + 0x38);
              *puVar122 = CONCAT44((*(int *)((long)d0 + 0x10) - *(int *)((long)d0 + 0x20)) +
                                   *(int *)((long)d0 + 0x30) + iVar165 + iVar164 >> 2,
                                   *(int *)d0 + *(int *)((long)d0 + 0x10) +
                                   *(int *)((long)d0 + 0x20) + iVar231 + iVar229 >> 2);
              *(ulong *)((long)puVar122 + (long)iStack_31c * local_338) =
                   CONCAT44((iVar164 - iVar165) + (iVar128 - iVar197) + iVar226 >> 2,
                            (iVar229 - iVar231) + iVar3 + iVar128 + iVar197 >> 2);
              puVar122 = puVar122 + 1;
              uVar134 = uVar134 - 1;
            } while (uVar134 != 0);
          }
          uVar126 = uVar126 + 1;
        } while (uVar126 != uVar135);
      }
      uVar138 = uVar138 + 1;
    } while (uVar138 != uVar119);
  }
  copy_cut_border((Mat *)d1,local_150,0,local_318 - local_150->h,0,iStack_31c - local_150->w,opt);
  piVar4 = (int *)CONCAT44(aiStack_340[1],aiStack_340[0]);
  if (piVar4 != (int *)0x0) {
    LOCK();
    *piVar4 = *piVar4 + -1;
    UNLOCK();
    if (*piVar4 == 0) {
      if (local_328 == (Allocator *)0x0) {
        if (d1 != (short  [4])0x0) {
          free((void *)d1);
        }
      }
      else {
        (*local_328->_vptr_Allocator[3])();
      }
    }
  }
  local_308 = 0;
  iStack_310 = 0;
  iStack_314 = 0;
  local_318 = 0;
  iStack_31c = 0;
  iStack_320 = 0;
  iStack_330 = 0;
  local_338 = 0;
  aiStack_340[1] = 0;
  aiStack_340[0] = 0;
  d1[0] = 0;
  d1[1] = 0;
  d1[2] = 0;
  d1[3] = 0;
  d0[0] = 0;
  d0[1] = 0;
  d0[2] = 0;
  d0[3] = 0;
  piVar4 = (int *)CONCAT44(local_248.refcount._4_4_,local_248.refcount._0_4_);
  if (piVar4 != (int *)0x0) {
    LOCK();
    *piVar4 = *piVar4 + -1;
    UNLOCK();
    if (*piVar4 == 0) {
      if (local_248.allocator == (Allocator *)0x0) {
        if (local_248.data != (void *)0x0) {
          free(local_248.data);
        }
      }
      else {
        (*(local_248.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  local_248.cstep = 0;
  local_248.data = (void *)0x0;
  local_248.refcount._0_4_ = 0;
  local_248.refcount._4_4_ = 0;
  local_248.elemsize = 0;
  local_248.elempack = 0;
  local_248.dims = 0;
  local_248.w = 0;
  local_248.h = 0;
  local_248.d = 0;
  local_248.c = 0;
  piVar4 = (int *)CONCAT44(local_1a8.refcount._4_4_,local_1a8.refcount._0_4_);
  if (piVar4 != (int *)0x0) {
    LOCK();
    *piVar4 = *piVar4 + -1;
    UNLOCK();
    if (*piVar4 == 0) {
      if (local_1a8.allocator == (Allocator *)0x0) {
        if (local_1a8.data != (void *)0x0) {
          free(local_1a8.data);
        }
      }
      else {
        (*(local_1a8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return;
}

Assistant:

static void conv3x3s1_winograd23_int8_sse(const Mat& bottom_blob, Mat& top_blob, const Mat& kernel_tm, const Option& opt)
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int inch = bottom_blob.c;

    int outw = top_blob.w;
    int outh = top_blob.h;
    int outch = top_blob.c;

    // pad to 2n+2, winograd F(2,3)
    Mat bottom_blob_bordered = bottom_blob;

    outw = (outw + 1) / 2 * 2;
    outh = (outh + 1) / 2 * 2;

    w = outw + 2;
    h = outh + 2;
    Option opt_b = opt;
    opt_b.blob_allocator = opt.workspace_allocator;
    copy_make_border(bottom_blob, bottom_blob_bordered, 0, h - bottom_blob.h, 0, w - bottom_blob.w, 0, 0.f, opt_b);

    // BEGIN transform input
    Mat bottom_blob_tm;
    {
        int w_tm = outw / 2 * 4;
        int h_tm = outh / 2 * 4;

        int nColBlocks = h_tm / 4; // may be the block num in Feathercnn
        int nRowBlocks = w_tm / 4;

        const int tiles = nColBlocks * nRowBlocks;

        bottom_blob_tm.create(4 * 4, tiles, inch, 2u, opt.workspace_allocator);

        // BT
        // const float itm[4][4] = {
        //     {1.0f,  0.0f, -1.0f,  0.0f},
        //     {0.0f,  1.0f,  1.00f, 0.0f},
        //     {0.0f, -1.0f,  1.00f, 0.0f},
        //     {0.0f, -1.0f,  0.00f, 1.0f}
        // };

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < inch; q++)
        {
            const signed char* img = bottom_blob_bordered.channel(q);
            short* out_tm0 = bottom_blob_tm.channel(q);

            for (int j = 0; j < nColBlocks; j++)
            {
                const signed char* r0 = img + w * j * 2;
                const signed char* r1 = r0 + w;
                const signed char* r2 = r1 + w;
                const signed char* r3 = r2 + w;

                for (int i = 0; i < nRowBlocks; i++)
                {
                    short d0[4], d1[4], d2[4], d3[4];
                    short w0[4], w1[4], w2[4], w3[4];
                    short t0[4], t1[4], t2[4], t3[4];
                    // load
                    for (int n = 0; n < 4; n++)
                    {
                        d0[n] = r0[n];
                        d1[n] = r1[n];
                        d2[n] = r2[n];
                        d3[n] = r3[n];
                    }
                    // w = B_t * d
                    for (int n = 0; n < 4; n++)
                    {
                        w0[n] = d0[n] - d2[n];
                        w1[n] = d1[n] + d2[n];
                        w2[n] = d2[n] - d1[n];
                        w3[n] = d3[n] - d1[n];
                    }
                    // transpose d to d_t
                    {
                        t0[0] = w0[0];
                        t1[0] = w0[1];
                        t2[0] = w0[2];
                        t3[0] = w0[3];
                        t0[1] = w1[0];
                        t1[1] = w1[1];
                        t2[1] = w1[2];
                        t3[1] = w1[3];
                        t0[2] = w2[0];
                        t1[2] = w2[1];
                        t2[2] = w2[2];
                        t3[2] = w2[3];
                        t0[3] = w3[0];
                        t1[3] = w3[1];
                        t2[3] = w3[2];
                        t3[3] = w3[3];
                    }
                    // U = B_t * d_t
                    for (int n = 0; n < 4; n++)
                    {
                        d0[n] = t0[n] - t2[n];
                        d1[n] = t1[n] + t2[n];
                        d2[n] = t2[n] - t1[n];
                        d3[n] = t3[n] - t1[n];
                    }
                    // save to out_tm
                    for (int n = 0; n < 4; n++)
                    {
                        out_tm0[n] = d0[n];
                        out_tm0[n + 4] = d1[n];
                        out_tm0[n + 8] = d2[n];
                        out_tm0[n + 12] = d3[n];
                    }

                    r0 += 2;
                    r1 += 2;
                    r2 += 2;
                    r3 += 2;

                    out_tm0 += 16;
                }
            }
        }
    }
    bottom_blob_bordered = Mat();

    // BEGIN dot
    Mat top_blob_tm;
    {
        int w_tm = outw / 2 * 4;
        int h_tm = outh / 2 * 4;

        int nColBlocks = h_tm / 4; // may be the block num in Feathercnn
        int nRowBlocks = w_tm / 4;

        const int tiles = nColBlocks * nRowBlocks;

        top_blob_tm.create(16, tiles, outch, 4u, opt.workspace_allocator);

        int nn_outch = outch >> 2;
        int remain_outch_start = nn_outch << 2;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int pp = 0; pp < nn_outch; pp++)
        {
            int p = pp * 4;

            Mat out0_tm = top_blob_tm.channel(p);
            Mat out1_tm = top_blob_tm.channel(p + 1);
            Mat out2_tm = top_blob_tm.channel(p + 2);
            Mat out3_tm = top_blob_tm.channel(p + 3);

            const Mat kernel0_tm = kernel_tm.channel(p);
            const Mat kernel1_tm = kernel_tm.channel(p + 1);
            const Mat kernel2_tm = kernel_tm.channel(p + 2);
            const Mat kernel3_tm = kernel_tm.channel(p + 3);

            for (int i = 0; i < tiles; i++)
            {
                int* output0_tm = out0_tm.row<int>(i);
                int* output1_tm = out1_tm.row<int>(i);
                int* output2_tm = out2_tm.row<int>(i);
                int* output3_tm = out3_tm.row<int>(i);

                int sum0[16] = {0};
                int sum1[16] = {0};
                int sum2[16] = {0};
                int sum3[16] = {0};

                int q = 0;
                for (; q + 3 < inch; q += 4)
                {
                    const short* r0 = bottom_blob_tm.channel(q).row<short>(i);
                    const short* r1 = bottom_blob_tm.channel(q + 1).row<short>(i);
                    const short* r2 = bottom_blob_tm.channel(q + 2).row<short>(i);
                    const short* r3 = bottom_blob_tm.channel(q + 3).row<short>(i);

                    const short* k0 = kernel0_tm.row<short>(q);
                    const short* k1 = kernel1_tm.row<short>(q);
                    const short* k2 = kernel2_tm.row<short>(q);
                    const short* k3 = kernel3_tm.row<short>(q);

                    for (int n = 0; n < 16; n++)
                    {
                        sum0[n] += (int)r0[n] * k0[n];
                        k0 += 16;
                        sum0[n] += (int)r1[n] * k0[n];
                        k0 += 16;
                        sum0[n] += (int)r2[n] * k0[n];
                        k0 += 16;
                        sum0[n] += (int)r3[n] * k0[n];
                        k0 -= 16 * 3;

                        sum1[n] += (int)r0[n] * k1[n];
                        k1 += 16;
                        sum1[n] += (int)r1[n] * k1[n];
                        k1 += 16;
                        sum1[n] += (int)r2[n] * k1[n];
                        k1 += 16;
                        sum1[n] += (int)r3[n] * k1[n];
                        k1 -= 16 * 3;

                        sum2[n] += (int)r0[n] * k2[n];
                        k2 += 16;
                        sum2[n] += (int)r1[n] * k2[n];
                        k2 += 16;
                        sum2[n] += (int)r2[n] * k2[n];
                        k2 += 16;
                        sum2[n] += (int)r3[n] * k2[n];
                        k2 -= 16 * 3;

                        sum3[n] += (int)r0[n] * k3[n];
                        k3 += 16;
                        sum3[n] += (int)r1[n] * k3[n];
                        k3 += 16;
                        sum3[n] += (int)r2[n] * k3[n];
                        k3 += 16;
                        sum3[n] += (int)r3[n] * k3[n];
                        k3 -= 16 * 3;
                    }
                }

                for (; q < inch; q++)
                {
                    const short* r0 = bottom_blob_tm.channel(q).row<short>(i);

                    const short* k0 = kernel0_tm.row<short>(q);
                    const short* k1 = kernel1_tm.row<short>(q);
                    const short* k2 = kernel2_tm.row<short>(q);
                    const short* k3 = kernel3_tm.row<short>(q);

                    for (int n = 0; n < 16; n++)
                    {
                        sum0[n] += (int)r0[n] * k0[n];
                        sum1[n] += (int)r0[n] * k1[n];
                        sum2[n] += (int)r0[n] * k2[n];
                        sum3[n] += (int)r0[n] * k3[n];
                    }
                }

                for (int n = 0; n < 16; n++)
                {
                    output0_tm[n] = sum0[n];
                    output1_tm[n] = sum1[n];
                    output2_tm[n] = sum2[n];
                    output3_tm[n] = sum3[n];
                }
            }
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int p = remain_outch_start; p < outch; p++)
        {
            Mat out0_tm = top_blob_tm.channel(p);
            const Mat kernel0_tm = kernel_tm.channel(p);

            for (int i = 0; i < tiles; i++)
            {
                int* output0_tm = out0_tm.row<int>(i);

                int sum0[16] = {0};

                int q = 0;
                for (; q + 3 < inch; q += 4)
                {
                    const short* r0 = bottom_blob_tm.channel(q).row<short>(i);
                    const short* r1 = bottom_blob_tm.channel(q + 1).row<short>(i);
                    const short* r2 = bottom_blob_tm.channel(q + 2).row<short>(i);
                    const short* r3 = bottom_blob_tm.channel(q + 3).row<short>(i);

                    const short* k0 = kernel0_tm.row<short>(q);
                    const short* k1 = kernel0_tm.row<short>(q + 1);
                    const short* k2 = kernel0_tm.row<short>(q + 2);
                    const short* k3 = kernel0_tm.row<short>(q + 3);

                    for (int n = 0; n < 16; n++)
                    {
                        sum0[n] += (int)r0[n] * k0[n];
                        sum0[n] += (int)r1[n] * k1[n];
                        sum0[n] += (int)r2[n] * k2[n];
                        sum0[n] += (int)r3[n] * k3[n];
                    }
                }

                for (; q < inch; q++)
                {
                    const short* r0 = bottom_blob_tm.channel(q).row<short>(i);
                    const short* k0 = kernel0_tm.row<short>(q);

                    for (int n = 0; n < 16; n++)
                    {
                        sum0[n] += (int)r0[n] * k0[n];
                    }
                }

                for (int n = 0; n < 16; n++)
                {
                    output0_tm[n] = sum0[n];
                }
            }
        }
    }
    bottom_blob_tm = Mat();
    // END dot

    // BEGIN transform output
    Mat top_blob_bordered;
    top_blob_bordered.create(outw, outh, outch, 4u, opt.workspace_allocator);
    {
        // AT
        // const float itm[2][4] = {
        //     {1.0f,  1.0f,  1.0f,  0.0f},
        //     {0.0f,  1.0f, -1.0f,  1.0f}
        // };

        int w_tm = outw / 2 * 4;
        int h_tm = outh / 2 * 4;

        int nColBlocks = h_tm / 4; // may be the block num in Feathercnn
        int nRowBlocks = w_tm / 4;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int p = 0; p < outch; p++)
        {
            Mat out_tm = top_blob_tm.channel(p);
            Mat out = top_blob_bordered.channel(p);

            for (int j = 0; j < nColBlocks; j++)
            {
                int* outRow0 = out.row<int>(j * 2);
                int* outRow1 = out.row<int>(j * 2 + 1);

                for (int i = 0; i < nRowBlocks; i++)
                {
                    int* out_tile = out_tm.row<int>(j * nRowBlocks + i);

                    int s0[4], s1[4], s2[4], s3[4];
                    int w0[4], w1[4];
                    int d0[2], d1[2], d2[2], d3[2];
                    int o0[2], o1[2];
                    // load
                    for (int n = 0; n < 4; n++)
                    {
                        s0[n] = out_tile[n];
                        s1[n] = out_tile[n + 4];
                        s2[n] = out_tile[n + 8];
                        s3[n] = out_tile[n + 12];
                    }
                    // w = A_T * W
                    for (int n = 0; n < 4; n++)
                    {
                        w0[n] = s0[n] + s1[n] + s2[n];
                        w1[n] = s1[n] - s2[n] + s3[n];
                    }
                    // transpose w to w_t
                    {
                        d0[0] = w0[0];
                        d0[1] = w1[0];
                        d1[0] = w0[1];
                        d1[1] = w1[1];
                        d2[0] = w0[2];
                        d2[1] = w1[2];
                        d3[0] = w0[3];
                        d3[1] = w1[3];
                    }
                    // Y = A_T * w_t
                    for (int n = 0; n < 2; n++)
                    {
                        o0[n] = d0[n] + d1[n] + d2[n];
                        o1[n] = d1[n] - d2[n] + d3[n];
                    }
                    // save to top blob tm,why right 2,because the G' = G*2
                    outRow0[0] = o0[0] >> 2;
                    outRow0[1] = o0[1] >> 2;
                    outRow1[0] = o1[0] >> 2;
                    outRow1[1] = o1[1] >> 2;

                    outRow0 += 2;
                    outRow1 += 2;
                }
            }
        }
    }
    // END transform output

    // cut result pad
    copy_cut_border(top_blob_bordered, top_blob, 0, top_blob_bordered.h - top_blob.h, 0, top_blob_bordered.w - top_blob.w, opt);
}